

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cpp
# Opt level: O1

void __thiscall
libcellml::Validator::ValidatorImpl::buildComponentIdMap
          (ValidatorImpl *this,ComponentPtr *component,IdMap *idMap,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *reportedConnections)

{
  IssueImpl *pIVar1;
  size_type sVar2;
  undefined8 uVar3;
  char cVar4;
  bool bVar5;
  int iVar6;
  long *plVar7;
  undefined8 *puVar8;
  size_t sVar9;
  const_iterator cVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  ValidatorImpl *pVVar12;
  NamedEntity *pNVar13;
  IdMap *pIVar14;
  element_type *peVar15;
  ulong *puVar16;
  long *plVar17;
  element_type *peVar18;
  ulong uVar19;
  size_type *psVar20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var21;
  size_t c;
  long lVar22;
  char cVar23;
  undefined8 uVar24;
  _Base_ptr p_Var25;
  _Base_ptr p_Var26;
  ValidatorImpl *pVVar27;
  _Alloc_hider _Var28;
  ulong uVar29;
  NamedEntity *pNVar30;
  pointer pcVar31;
  string owning;
  string mappingId;
  string connectionId;
  string connection;
  string connectionDescription;
  string imported;
  ResetPtr item_1;
  IssuePtr issue;
  string info;
  IssuePtr issue_1;
  VariablePtr item;
  VariablePtr equiv;
  ComponentPtr equivParent;
  undefined1 local_350 [16];
  undefined1 local_340 [16];
  undefined1 local_330 [16];
  undefined1 local_320 [24];
  _Base_ptr local_308;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_300;
  undefined1 local_2f0 [32];
  Validator *local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  undefined1 local_2a8 [32];
  undefined1 local_288 [32];
  IssuePtr local_268;
  undefined1 local_258 [32];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_238;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_230;
  string local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  IssuePtr local_1e0;
  element_type local_1d0;
  ValidatorImpl *local_1c0;
  undefined1 local_1b8 [24];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  string local_188;
  undefined1 local_168 [24];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_138;
  string local_130;
  ParentedEntityConstPtr local_110;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  ulong local_40;
  _Base_ptr local_38;
  
  local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
  local_220._M_string_length = 0;
  local_220.field_2._M_local_buf[0] = '\0';
  local_2d0 = (Validator *)component;
  local_258._16_8_ = idMap;
  local_1c0 = this;
  local_138 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
               *)reportedConnections;
  Entity::id_abi_cxx11_
            ((string *)local_2a8,
             (Entity *)
             (component->super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr);
  uVar24 = local_2a8._8_8_;
  pNVar30 = (NamedEntity *)(local_2a8 + 0x10);
  if ((NamedEntity *)local_2a8._0_8_ != pNVar30) {
    operator_delete((void *)local_2a8._0_8_,local_2a8._16_8_ + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar24 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_2a8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_2a8._16_8_ = local_2a8._16_8_ & 0xffffffffffffff00;
    local_350._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_340._0_8_ = local_340._0_8_ & 0xffffffffffffff00;
    local_350._0_8_ = (IdMap *)local_340;
    local_2a8._0_8_ = pNVar30;
    bVar5 = ImportedEntity::isImport
                      (&((__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> *)
                        &local_2d0->super_Logger)->_M_ptr->super_ImportedEntity);
    if (bVar5) {
      std::__cxx11::string::_M_replace((ulong)local_2a8,0,(char *)local_2a8._8_8_,0x2b7349);
    }
    local_320._16_8_ =
         ((__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> *)&local_2d0->super_Logger
         )->_M_ptr;
    local_308 = (_Base_ptr)
                (((__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> *)
                 &local_2d0->super_Logger)->_M_refcount)._M_pi;
    if (local_308 != (_Base_ptr)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&local_308->_M_parent = *(int *)&local_308->_M_parent + 1;
        UNLOCK();
      }
      else {
        *(int *)&local_308->_M_parent = *(int *)&local_308->_M_parent + 1;
      }
    }
    owningComponent((ParentedEntityConstPtr *)local_330);
    if ((_Base_ptr)local_330._8_8_ != (_Base_ptr)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_330._8_8_);
    }
    if (local_308 != (_Base_ptr)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_308);
    }
    if ((_Base_ptr)local_330._0_8_ == (_Base_ptr)0x0) {
      local_288._0_8_ =
           ((__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> *)
           &local_2d0->super_Logger)->_M_ptr;
      local_288._8_8_ =
           (((__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> *)
            &local_2d0->super_Logger)->_M_refcount)._M_pi;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_)->_M_use_count + 1;
        }
      }
      owningModel((ParentedEntityConstPtr *)&local_2c8);
      NamedEntity::name_abi_cxx11_((string *)local_2f0,(NamedEntity *)local_2c8._M_dataplus._M_p);
      puVar8 = (undefined8 *)std::__cxx11::string::replace((ulong)local_2f0,0,(char *)0x0,0x2b72ad);
      local_320._16_8_ = &local_300;
      paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar8 == paVar11) {
        local_300._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_300._8_8_ = puVar8[3];
      }
      else {
        local_300._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_320._16_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*puVar8;
      }
      local_308 = (_Base_ptr)puVar8[1];
      *puVar8 = paVar11;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append(local_320 + 0x10);
    }
    else {
      local_288._0_8_ =
           ((__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> *)
           &local_2d0->super_Logger)->_M_ptr;
      local_288._8_8_ =
           (((__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> *)
            &local_2d0->super_Logger)->_M_refcount)._M_pi;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_)->_M_use_count + 1;
        }
      }
      owningComponent((ParentedEntityConstPtr *)&local_2c8);
      NamedEntity::name_abi_cxx11_((string *)local_2f0,(NamedEntity *)local_2c8._M_dataplus._M_p);
      plVar7 = (long *)std::__cxx11::string::replace((ulong)local_2f0,0,(char *)0x0,0x29d5a1);
      local_320._16_8_ = &local_300;
      paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 == paVar11) {
        local_300._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_300._8_8_ = plVar7[3];
      }
      else {
        local_300._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_320._16_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*plVar7;
      }
      local_308 = (_Base_ptr)plVar7[1];
      *plVar7 = (long)paVar11;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append(local_320 + 0x10);
    }
    p_Var25 = (_Base_ptr)(plVar7 + 2);
    if ((_Base_ptr)*plVar7 == p_Var25) {
      local_320._0_8_ = *(undefined8 *)p_Var25;
      local_320._8_8_ = plVar7[3];
      local_330._0_8_ = (_Base_ptr)local_320;
    }
    else {
      local_320._0_8_ = *(undefined8 *)p_Var25;
      local_330._0_8_ = (_Base_ptr)*plVar7;
    }
    local_330._8_8_ = plVar7[1];
    *plVar7 = (long)p_Var25;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    std::__cxx11::string::operator=((string *)local_350,(string *)local_330);
    if ((_Base_ptr)local_330._0_8_ != (_Base_ptr)local_320) {
      operator_delete((void *)local_330._0_8_,(ulong)(local_320._0_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._16_8_ != &local_300) {
      operator_delete((void *)local_320._16_8_,local_300._M_allocated_capacity + 1);
    }
    if ((ValidatorImpl *)local_2f0._0_8_ != (ValidatorImpl *)(local_2f0 + 0x10)) {
      operator_delete((void *)local_2f0._0_8_,(ulong)(local_2f0._16_8_ + 1));
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2c8._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2c8._M_string_length);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_);
    }
    std::operator+(&local_2c8," - ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a8);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_2c8);
    pVVar27 = (ValidatorImpl *)(local_2f0 + 0x10);
    pVVar12 = (ValidatorImpl *)(plVar7 + 2);
    if ((ValidatorImpl *)*plVar7 == pVVar12) {
      local_2f0._16_8_ =
           (pVVar12->super_LoggerImpl).mErrors.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_2f0._24_8_ = plVar7[3];
      local_2f0._0_8_ = pVVar27;
    }
    else {
      local_2f0._16_8_ =
           (pVVar12->super_LoggerImpl).mErrors.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_2f0._0_8_ = (ValidatorImpl *)*plVar7;
    }
    local_2f0._8_8_ = plVar7[1];
    *plVar7 = (long)pVVar12;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    NamedEntity::name_abi_cxx11_
              ((string *)local_288,
               (NamedEntity *)
               ((__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> *)
               &local_2d0->super_Logger)->_M_ptr);
    p_Var25 = (_Base_ptr)
              ((long)&((__shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2> *)local_2f0._8_8_
                      )->_M_ptr + (long)(_func_int ***)local_288._8_8_);
    p_Var26 = (_Base_ptr)0xf;
    if ((ValidatorImpl *)local_2f0._0_8_ != pVVar27) {
      p_Var26 = (_Base_ptr)local_2f0._16_8_;
    }
    if (p_Var26 < p_Var25) {
      p_Var26 = (_Base_ptr)0xf;
      if ((ValidatorImpl *)local_288._0_8_ != (ValidatorImpl *)(local_288 + 0x10)) {
        p_Var26 = (_Base_ptr)local_288._16_8_;
      }
      if (p_Var26 < p_Var25) goto LAB_0028a9dc;
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)local_288,0,(char *)0x0,local_2f0._0_8_);
    }
    else {
LAB_0028a9dc:
      puVar8 = (undefined8 *)std::__cxx11::string::_M_append(local_2f0,local_288._0_8_);
    }
    local_320._16_8_ = &local_300;
    paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar8 == paVar11) {
      local_300._M_allocated_capacity = paVar11->_M_allocated_capacity;
      local_300._8_8_ = puVar8[3];
    }
    else {
      local_300._M_allocated_capacity = paVar11->_M_allocated_capacity;
      local_320._16_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*puVar8;
    }
    local_308 = (_Base_ptr)puVar8[1];
    *puVar8 = paVar11;
    puVar8[1] = 0;
    paVar11->_M_local_buf[0] = '\0';
    plVar7 = (long *)std::__cxx11::string::_M_append(local_320 + 0x10,local_350._0_8_);
    p_Var25 = (_Base_ptr)(plVar7 + 2);
    if ((_Base_ptr)*plVar7 == p_Var25) {
      local_320._0_8_ = *(undefined8 *)p_Var25;
      local_320._8_8_ = plVar7[3];
      local_330._0_8_ = (_Base_ptr)local_320;
    }
    else {
      local_320._0_8_ = *(undefined8 *)p_Var25;
      local_330._0_8_ = (_Base_ptr)*plVar7;
    }
    local_330._8_8_ = plVar7[1];
    *plVar7 = (long)p_Var25;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_220,(string *)local_330);
    if ((_Base_ptr)local_330._0_8_ != (_Base_ptr)local_320) {
      operator_delete((void *)local_330._0_8_,(ulong)(local_320._0_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._16_8_ != &local_300) {
      operator_delete((void *)local_320._16_8_,(ulong)(local_300._M_allocated_capacity + 1));
    }
    if ((ValidatorImpl *)local_288._0_8_ != (ValidatorImpl *)(local_288 + 0x10)) {
      operator_delete((void *)local_288._0_8_,(ulong)(local_288._16_8_ + 1));
    }
    if ((ValidatorImpl *)local_2f0._0_8_ != pVVar27) {
      operator_delete((void *)local_2f0._0_8_,(ulong)(local_2f0._16_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
      operator_delete(local_2c8._M_dataplus._M_p,
                      (ulong)(local_2c8.field_2._M_allocated_capacity + 1));
    }
    pVVar27 = (ValidatorImpl *)local_330;
    Entity::id_abi_cxx11_
              ((string *)pVVar27,
               (Entity *)
               ((__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> *)
               &local_2d0->super_Logger)->_M_ptr);
    addIdMapItem(pVVar27,(string *)local_330,&local_220,(IdMap *)local_258._16_8_);
    if ((_Base_ptr)local_330._0_8_ != (_Base_ptr)local_320) {
      operator_delete((void *)local_330._0_8_,(ulong)(local_320._0_8_ + 1));
    }
    if ((IdMap *)local_350._0_8_ != (IdMap *)local_340) {
      operator_delete((void *)local_350._0_8_,(ulong)(local_340._0_8_ + 1));
    }
    if ((NamedEntity *)local_2a8._0_8_ != pNVar30) {
      operator_delete((void *)local_2a8._0_8_,local_2a8._16_8_ + 1);
    }
  }
  local_38 = (_Base_ptr)(local_138 + 8);
  uVar29 = 0;
  while( true ) {
    pNVar30 = (NamedEntity *)(local_2a8 + 0x10);
    sVar9 = Component::variableCount
                      (((__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> *)
                       &local_2d0->super_Logger)->_M_ptr);
    if (sVar9 <= uVar29) break;
    Component::variable((Component *)local_1b8,
                        (size_t)((__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> *)
                                &local_2d0->super_Logger)->_M_ptr);
    local_40 = uVar29;
    Entity::id_abi_cxx11_((string *)local_2a8,(Entity *)local_1b8._0_8_);
    uVar24 = local_2a8._8_8_;
    if ((NamedEntity *)local_2a8._0_8_ != pNVar30) {
      operator_delete((void *)local_2a8._0_8_,local_2a8._16_8_ + 1);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar24 !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      NamedEntity::name_abi_cxx11_((string *)local_2f0,(NamedEntity *)local_1b8._0_8_);
      puVar8 = (undefined8 *)std::__cxx11::string::replace((ulong)local_2f0,0,(char *)0x0,0x2b7353);
      local_320._16_8_ = &local_300;
      paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar8 == paVar11) {
        local_300._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_300._8_8_ = puVar8[3];
      }
      else {
        local_300._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_320._16_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*puVar8;
      }
      local_308 = (_Base_ptr)puVar8[1];
      *puVar8 = paVar11;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append(local_320 + 0x10);
      p_Var25 = (_Base_ptr)(plVar7 + 2);
      if ((_Base_ptr)*plVar7 == p_Var25) {
        local_320._0_8_ = *(undefined8 *)p_Var25;
        local_320._8_8_ = plVar7[3];
        local_330._0_8_ = (_Base_ptr)local_320;
      }
      else {
        local_320._0_8_ = *(undefined8 *)p_Var25;
        local_330._0_8_ = (_Base_ptr)*plVar7;
      }
      local_330._8_8_ = plVar7[1];
      *plVar7 = (long)p_Var25;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      NamedEntity::name_abi_cxx11_
                (&local_2c8,
                 (NamedEntity *)
                 ((__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> *)
                 &local_2d0->super_Logger)->_M_ptr);
      p_Var25 = (_Base_ptr)0xf;
      if ((_Base_ptr)local_330._0_8_ != (_Base_ptr)local_320) {
        p_Var25 = (_Base_ptr)local_320._0_8_;
      }
      p_Var26 = (_Base_ptr)
                ((long)(_func_int ***)local_330._8_8_ +
                (long)(_func_int ***)local_2c8._M_string_length);
      if (p_Var25 < p_Var26) {
        uVar24 = (_Base_ptr)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
          uVar24 = local_2c8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar24 < p_Var26) goto LAB_0028ad95;
        plVar7 = (long *)std::__cxx11::string::replace
                                   ((ulong)&local_2c8,0,(char *)0x0,local_330._0_8_);
      }
      else {
LAB_0028ad95:
        plVar7 = (long *)std::__cxx11::string::_M_append
                                   ((char *)local_330,(ulong)local_2c8._M_dataplus._M_p);
      }
      local_350._0_8_ = local_340;
      pIVar14 = (IdMap *)(plVar7 + 2);
      if ((IdMap *)*plVar7 == pIVar14) {
        local_340._0_8_ = *(undefined8 *)&(pIVar14->_M_t)._M_impl;
        local_340._8_8_ = plVar7[3];
      }
      else {
        local_340._0_8_ = *(undefined8 *)&(pIVar14->_M_t)._M_impl;
        local_350._0_8_ = (IdMap *)*plVar7;
      }
      local_350._8_8_ = plVar7[1];
      *plVar7 = (long)pIVar14;
      plVar7[1] = 0;
      *(undefined1 *)&(pIVar14->_M_t)._M_impl = 0;
      plVar7 = (long *)std::__cxx11::string::append(local_350);
      pNVar13 = (NamedEntity *)(plVar7 + 2);
      if ((NamedEntity *)*plVar7 == pNVar13) {
        local_2a8._16_8_ = (pNVar13->super_ParentedEntity).super_Entity._vptr_Entity;
        local_2a8._24_8_ = plVar7[3];
        local_2a8._0_8_ = pNVar30;
      }
      else {
        local_2a8._16_8_ = (pNVar13->super_ParentedEntity).super_Entity._vptr_Entity;
        local_2a8._0_8_ = (NamedEntity *)*plVar7;
      }
      local_2a8._8_8_ = plVar7[1];
      *plVar7 = (long)pNVar13;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_220,(string *)local_2a8);
      if ((NamedEntity *)local_2a8._0_8_ != pNVar30) {
        operator_delete((void *)local_2a8._0_8_,local_2a8._16_8_ + 1);
      }
      if ((IdMap *)local_350._0_8_ != (IdMap *)local_340) {
        operator_delete((void *)local_350._0_8_,(ulong)(local_340._0_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
        operator_delete(local_2c8._M_dataplus._M_p,
                        (ulong)(local_2c8.field_2._M_allocated_capacity + 1));
      }
      if ((_Base_ptr)local_330._0_8_ != (_Base_ptr)local_320) {
        operator_delete((void *)local_330._0_8_,(ulong)(local_320._0_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_320._16_8_ != &local_300) {
        operator_delete((void *)local_320._16_8_,(ulong)(local_300._M_allocated_capacity + 1));
      }
      if ((ValidatorImpl *)local_2f0._0_8_ != (ValidatorImpl *)(local_2f0 + 0x10)) {
        operator_delete((void *)local_2f0._0_8_,(ulong)(local_2f0._16_8_ + 1));
      }
      pVVar27 = (ValidatorImpl *)local_2a8;
      Entity::id_abi_cxx11_((string *)local_2a8,(Entity *)local_1b8._0_8_);
      addIdMapItem(pVVar27,(string *)local_2a8,&local_220,(IdMap *)local_258._16_8_);
      if ((NamedEntity *)local_2a8._0_8_ != pNVar30) {
        operator_delete((void *)local_2a8._0_8_,local_2a8._16_8_ + 1);
      }
    }
    uVar29 = 0;
    while( true ) {
      sVar9 = Variable::equivalentVariableCount((Variable *)local_1b8._0_8_);
      if (sVar9 <= uVar29) break;
      Variable::equivalentVariable((Variable *)local_168,local_1b8._0_8_);
      local_2a8._0_8_ = local_168._0_8_;
      local_2a8._8_8_ = local_168._8_8_;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_168._8_8_ + 8) = *(_Atomic_word *)(local_168._8_8_ + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(local_168._8_8_ + 8) = *(_Atomic_word *)(local_168._8_8_ + 8) + 1;
        }
      }
      owningComponent(&local_110);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a8._8_8_);
      }
      if (local_110.super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr != (element_type *)0x0) {
        NamedEntity::name_abi_cxx11_((string *)local_350,(NamedEntity *)local_1b8._0_8_);
        NamedEntity::name_abi_cxx11_
                  ((string *)local_330,
                   (NamedEntity *)
                   ((__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> *)
                   &local_2d0->super_Logger)->_M_ptr);
        p_Var25 = (_Base_ptr)0xf;
        if ((IdMap *)local_350._0_8_ != (IdMap *)local_340) {
          p_Var25 = (_Base_ptr)local_340._0_8_;
        }
        p_Var26 = (_Base_ptr)
                  ((long)(_func_int ***)local_350._8_8_ + (long)(_func_int ***)local_330._8_8_);
        if (p_Var25 < p_Var26) {
          p_Var25 = (_Base_ptr)0xf;
          if ((_Base_ptr)local_330._0_8_ != (_Base_ptr)local_320) {
            p_Var25 = (_Base_ptr)local_320._0_8_;
          }
          if (p_Var25 < p_Var26) goto LAB_0028b064;
          plVar7 = (long *)std::__cxx11::string::replace
                                     ((ulong)local_330,0,(char *)0x0,local_350._0_8_);
        }
        else {
LAB_0028b064:
          plVar7 = (long *)std::__cxx11::string::_M_append(local_350,local_330._0_8_);
        }
        pNVar30 = (NamedEntity *)(plVar7 + 2);
        if ((NamedEntity *)*plVar7 == pNVar30) {
          local_2a8._16_8_ = (pNVar30->super_ParentedEntity).super_Entity._vptr_Entity;
          local_2a8._24_8_ = plVar7[3];
          local_2a8._0_8_ = (NamedEntity *)(local_2a8 + 0x10);
        }
        else {
          local_2a8._16_8_ = (pNVar30->super_ParentedEntity).super_Entity._vptr_Entity;
          local_2a8._0_8_ = (NamedEntity *)*plVar7;
        }
        local_2a8._8_8_ = plVar7[1];
        *plVar7 = (long)pNVar30;
        plVar7[1] = 0;
        *(undefined1 *)&(pNVar30->super_ParentedEntity).super_Entity._vptr_Entity = 0;
        if ((_Base_ptr)local_330._0_8_ != (_Base_ptr)local_320) {
          operator_delete((void *)local_330._0_8_,(ulong)(local_320._0_8_ + 1));
        }
        if ((IdMap *)local_350._0_8_ != (IdMap *)local_340) {
          operator_delete((void *)local_350._0_8_,(ulong)(local_340._0_8_ + 1));
        }
        NamedEntity::name_abi_cxx11_((string *)local_330,(NamedEntity *)local_168._0_8_);
        NamedEntity::name_abi_cxx11_
                  ((string *)(local_320 + 0x10),
                   (NamedEntity *)
                   local_110.
                   super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
        p_Var25 = (_Base_ptr)0xf;
        if ((_Base_ptr)local_330._0_8_ != (_Base_ptr)local_320) {
          p_Var25 = (_Base_ptr)local_320._0_8_;
        }
        p_Var26 = (_Base_ptr)((long)(_func_int ***)local_330._8_8_ + (long)&local_308->_M_color);
        if (p_Var25 < p_Var26) {
          uVar24 = (_Base_ptr)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_320._16_8_ != &local_300) {
            uVar24 = local_300._M_allocated_capacity;
          }
          if ((ulong)uVar24 < p_Var26) goto LAB_0028b168;
          plVar7 = (long *)std::__cxx11::string::replace
                                     ((ulong)(local_320 + 0x10),0,(char *)0x0,local_330._0_8_);
        }
        else {
LAB_0028b168:
          plVar7 = (long *)std::__cxx11::string::_M_append((char *)local_330,local_320._16_8_);
        }
        local_350._0_8_ = local_340;
        pIVar14 = (IdMap *)(plVar7 + 2);
        if ((IdMap *)*plVar7 == pIVar14) {
          local_340._0_8_ = *(undefined8 *)&(pIVar14->_M_t)._M_impl;
          local_340._8_8_ = plVar7[3];
        }
        else {
          local_340._0_8_ = *(undefined8 *)&(pIVar14->_M_t)._M_impl;
          local_350._0_8_ = (IdMap *)*plVar7;
        }
        local_350._8_8_ = plVar7[1];
        *plVar7 = (long)pIVar14;
        plVar7[1] = 0;
        *(undefined1 *)&(pIVar14->_M_t)._M_impl = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_320._16_8_ != &local_300) {
          operator_delete((void *)local_320._16_8_,(ulong)(local_300._M_allocated_capacity + 1));
        }
        if ((_Base_ptr)local_330._0_8_ != (_Base_ptr)local_320) {
          operator_delete((void *)local_330._0_8_,(ulong)(local_320._0_8_ + 1));
        }
        Variable::equivalenceMappingId_abi_cxx11_
                  ((string *)local_330,(Variable *)local_1b8,(VariablePtr *)local_168,
                   (VariablePtr *)pIVar14);
        uVar3 = local_2a8._8_8_;
        uVar24 = local_350._8_8_;
        p_Var21 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a8._8_8_;
        if ((ulong)local_350._8_8_ < (ulong)local_2a8._8_8_) {
          p_Var21 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_350._8_8_;
        }
        if (p_Var21 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          iVar6 = 0;
        }
        else {
          iVar6 = memcmp((void *)local_2a8._0_8_,(void *)local_350._0_8_,(size_t)p_Var21);
        }
        if (iVar6 == 0) {
          lVar22 = uVar3 - uVar24;
          if (lVar22 < -0x7fffffff) {
            lVar22 = -0x80000000;
          }
          if (0x7ffffffe < lVar22) {
            lVar22 = 0x7fffffff;
          }
          iVar6 = (int)lVar22;
        }
        if ((iVar6 < 0) && ((_Base_ptr)local_330._8_8_ != (_Base_ptr)0x0)) {
          NamedEntity::name_abi_cxx11_((string *)(local_168 + 0x10),(NamedEntity *)local_1b8._0_8_);
          plVar7 = (long *)std::__cxx11::string::replace
                                     ((ulong)(local_168 + 0x10),0,(char *)0x0,0x2b7361);
          local_1e0.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               &local_1d0;
          peVar15 = (element_type *)(plVar7 + 2);
          if ((element_type *)*plVar7 == peVar15) {
            local_1d0._vptr_Issue = peVar15->_vptr_Issue;
            local_1d0.mPimpl = (IssueImpl *)plVar7[3];
          }
          else {
            local_1d0._vptr_Issue = peVar15->_vptr_Issue;
            local_1e0.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)*plVar7;
          }
          local_1e0.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar7[1];
          *plVar7 = (long)peVar15;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_1e0);
          local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
          puVar16 = (ulong *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar16) {
            local_200.field_2._M_allocated_capacity = *puVar16;
            local_200.field_2._8_8_ = plVar7[3];
          }
          else {
            local_200.field_2._M_allocated_capacity = *puVar16;
            local_200._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_200._M_string_length = plVar7[1];
          *plVar7 = (long)puVar16;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          NamedEntity::name_abi_cxx11_
                    (&local_188,
                     (NamedEntity *)
                     ((__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> *)
                     &local_2d0->super_Logger)->_M_ptr);
          uVar24 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_200._M_dataplus._M_p != &local_200.field_2) {
            uVar24 = local_200.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar24 < local_188._M_string_length + local_200._M_string_length) {
            uVar24 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_188._M_dataplus._M_p != &local_188.field_2) {
              uVar24 = local_188.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar24 < local_188._M_string_length + local_200._M_string_length)
            goto LAB_0028b3f5;
            plVar7 = (long *)std::__cxx11::string::replace
                                       ((ulong)&local_188,0,(char *)0x0,
                                        (ulong)local_200._M_dataplus._M_p);
          }
          else {
LAB_0028b3f5:
            plVar7 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_200,(ulong)local_188._M_dataplus._M_p);
          }
          local_268.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)local_258;
          peVar18 = (element_type *)(plVar7 + 2);
          if ((element_type *)*plVar7 == peVar18) {
            local_258._0_8_ =
                 (peVar18->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.
                 super_Entity._vptr_Entity;
            local_258._8_8_ = plVar7[3];
          }
          else {
            local_258._0_8_ =
                 (peVar18->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.
                 super_Entity._vptr_Entity;
            local_268.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)*plVar7;
          }
          local_268.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar7[1];
          *plVar7 = (long)peVar18;
          plVar7[1] = 0;
          *(undefined1 *)
           &(peVar18->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.
            _vptr_Entity = 0;
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_268);
          local_258._24_8_ = &local_230;
          paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 == paVar11) {
            local_230._M_allocated_capacity = paVar11->_M_allocated_capacity;
            local_230._8_8_ = plVar7[3];
          }
          else {
            local_230._M_allocated_capacity = paVar11->_M_allocated_capacity;
            local_258._24_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*plVar7;
          }
          local_238 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar7[1];
          *plVar7 = (long)paVar11;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          NamedEntity::name_abi_cxx11_(&local_130,(NamedEntity *)local_168._0_8_);
          uVar24 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_258._24_8_ != &local_230) {
            uVar24 = local_230._M_allocated_capacity;
          }
          uVar19 = (long)&local_238->_vptr__Sp_counted_base + local_130._M_string_length;
          if ((ulong)uVar24 < uVar19) {
            uVar24 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_130._M_dataplus._M_p != &local_130.field_2) {
              uVar24 = local_130.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar24 < uVar19) goto LAB_0028b551;
            plVar7 = (long *)std::__cxx11::string::replace
                                       ((ulong)&local_130,0,(char *)0x0,local_258._24_8_);
          }
          else {
LAB_0028b551:
            plVar7 = (long *)std::__cxx11::string::_M_append
                                       (local_258 + 0x18,(ulong)local_130._M_dataplus._M_p);
          }
          local_288._0_8_ = local_288 + 0x10;
          pVVar27 = (ValidatorImpl *)(plVar7 + 2);
          if ((ValidatorImpl *)*plVar7 == pVVar27) {
            local_288._16_8_ =
                 (pVVar27->super_LoggerImpl).mErrors.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
            local_288._24_8_ = plVar7[3];
          }
          else {
            local_288._16_8_ =
                 (pVVar27->super_LoggerImpl).mErrors.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
            local_288._0_8_ = (ValidatorImpl *)*plVar7;
          }
          local_288._8_8_ = plVar7[1];
          *plVar7 = (long)pVVar27;
          plVar7[1] = 0;
          *(undefined1 *)
           &(pVVar27->super_LoggerImpl).mErrors.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start = 0;
          plVar7 = (long *)std::__cxx11::string::append(local_288);
          local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
          plVar17 = plVar7 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)plVar17) {
            local_2c8.field_2._M_allocated_capacity = *plVar17;
            local_2c8.field_2._8_8_ = plVar7[3];
          }
          else {
            local_2c8.field_2._M_allocated_capacity = *plVar17;
            local_2c8._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_2c8._M_string_length = plVar7[1];
          *plVar7 = (long)plVar17;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          NamedEntity::name_abi_cxx11_
                    ((string *)(local_1b8 + 0x10),
                     (NamedEntity *)
                     local_110.
                     super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr);
          uVar24 = (element_type *)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
            uVar24 = local_2c8.field_2._M_allocated_capacity;
          }
          peVar18 = (element_type *)
                    ((long)(_func_int ***)local_2c8._M_string_length +
                    (long)&(local_1a0._M_pi)->_vptr__Sp_counted_base);
          if ((ulong)uVar24 < peVar18) {
            uVar24 = (element_type *)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1b8._16_8_ != &local_198) {
              uVar24 = local_198._M_allocated_capacity;
            }
            if ((ulong)uVar24 < peVar18) goto LAB_0028b6ad;
            plVar7 = (long *)std::__cxx11::string::replace
                                       ((ulong)(local_1b8 + 0x10),0,(char *)0x0,
                                        (ulong)local_2c8._M_dataplus._M_p);
          }
          else {
LAB_0028b6ad:
            plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_2c8,local_1b8._16_8_);
          }
          pVVar27 = (ValidatorImpl *)(plVar7 + 2);
          if ((ValidatorImpl *)*plVar7 == pVVar27) {
            local_2f0._16_8_ =
                 (pVVar27->super_LoggerImpl).mErrors.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
            local_2f0._24_8_ = plVar7[3];
            local_2f0._0_8_ = (ValidatorImpl *)(local_2f0 + 0x10);
          }
          else {
            local_2f0._16_8_ =
                 (pVVar27->super_LoggerImpl).mErrors.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
            local_2f0._0_8_ = (ValidatorImpl *)*plVar7;
          }
          local_2f0._8_8_ = plVar7[1];
          *plVar7 = (long)pVVar27;
          plVar7[1] = 0;
          *(undefined1 *)
           &(pVVar27->super_LoggerImpl).mErrors.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start = 0;
          puVar8 = (undefined8 *)std::__cxx11::string::append(local_2f0);
          local_320._16_8_ = &local_300;
          paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar8 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar8 == paVar11) {
            local_300._M_allocated_capacity = paVar11->_M_allocated_capacity;
            local_300._8_8_ = puVar8[3];
          }
          else {
            local_300._M_allocated_capacity = paVar11->_M_allocated_capacity;
            local_320._16_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*puVar8;
          }
          local_308 = (_Base_ptr)puVar8[1];
          *puVar8 = paVar11;
          puVar8[1] = 0;
          *(undefined1 *)(puVar8 + 2) = 0;
          if ((ValidatorImpl *)local_2f0._0_8_ != (ValidatorImpl *)(local_2f0 + 0x10)) {
            operator_delete((void *)local_2f0._0_8_,(ulong)(local_2f0._16_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b8._16_8_ != &local_198) {
            operator_delete((void *)local_1b8._16_8_,(ulong)(local_198._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
            operator_delete(local_2c8._M_dataplus._M_p,
                            (ulong)(local_2c8.field_2._M_allocated_capacity + 1));
          }
          if ((ValidatorImpl *)local_288._0_8_ != (ValidatorImpl *)(local_288 + 0x10)) {
            operator_delete((void *)local_288._0_8_,(ulong)(local_288._16_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130._M_dataplus._M_p != &local_130.field_2) {
            operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_258._24_8_ != &local_230) {
            operator_delete((void *)local_258._24_8_,local_230._M_allocated_capacity + 1);
          }
          if ((element_type *)
              local_268.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)local_258) {
            operator_delete(local_268.
                            super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                            (ulong)((long)&((__shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                                             *)local_258._0_8_)->_M_ptr + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p != &local_188.field_2) {
            operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_200._M_dataplus._M_p != &local_200.field_2) {
            operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
          }
          if (local_1e0.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              &local_1d0) {
            operator_delete(local_1e0.
                            super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                            (long)local_1d0._vptr_Issue + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_168._16_8_ != &local_148) {
            operator_delete((void *)local_168._16_8_,(ulong)(local_148._M_allocated_capacity + 1));
          }
          bVar5 = isValidXmlName((string *)local_330);
          if (!bVar5) {
            Issue::IssueImpl::create();
            Issue::IssueImpl::setReferenceRule
                      ((IssueImpl *)
                       (((ComponentEntity *)
                        &(local_268.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->_vptr_Issue)->super_NamedEntity).super_ParentedEntity.
                       super_Entity.mPimpl,XML_ID_ATTRIBUTE);
            AnyCellmlElement::AnyCellmlElementImpl::setMapVariables
                      (((((IssueImpl *)
                         (((ComponentEntity *)
                          &(local_268.
                            super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                           ->_vptr_Issue)->super_NamedEntity).super_ParentedEntity.super_Entity.
                         mPimpl)->mItem).
                        super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->mPimpl,(VariablePtr *)local_1b8,(VariablePtr *)local_168);
            pIVar1 = (IssueImpl *)
                     (((ComponentEntity *)
                      &(local_268.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->_vptr_Issue)->super_NamedEntity).super_ParentedEntity.super_Entity.
                     mPimpl;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_258 + 0x18),"Variable equivalence ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_320 + 0x10));
            plVar7 = (long *)std::__cxx11::string::append((char *)(local_258 + 0x18));
            local_288._0_8_ = local_288 + 0x10;
            pVVar27 = (ValidatorImpl *)(plVar7 + 2);
            if ((ValidatorImpl *)*plVar7 == pVVar27) {
              local_288._16_8_ =
                   (pVVar27->super_LoggerImpl).mErrors.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
              local_288._24_8_ = plVar7[3];
            }
            else {
              local_288._16_8_ =
                   (pVVar27->super_LoggerImpl).mErrors.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
              local_288._0_8_ = (ValidatorImpl *)*plVar7;
            }
            local_288._8_8_ = plVar7[1];
            *plVar7 = (long)pVVar27;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            plVar7 = (long *)std::__cxx11::string::_M_append(local_288,local_330._0_8_);
            local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
            plVar17 = plVar7 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar7 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)plVar17) {
              local_2c8.field_2._M_allocated_capacity = *plVar17;
              local_2c8.field_2._8_8_ = plVar7[3];
            }
            else {
              local_2c8.field_2._M_allocated_capacity = *plVar17;
              local_2c8._M_dataplus._M_p = (pointer)*plVar7;
            }
            local_2c8._M_string_length = plVar7[1];
            *plVar7 = (long)plVar17;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            plVar7 = (long *)std::__cxx11::string::append((char *)&local_2c8);
            local_2f0._0_8_ = local_2f0 + 0x10;
            pVVar27 = (ValidatorImpl *)(plVar7 + 2);
            if ((ValidatorImpl *)*plVar7 == pVVar27) {
              local_2f0._16_8_ =
                   (pVVar27->super_LoggerImpl).mErrors.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
              local_2f0._24_8_ = plVar7[3];
            }
            else {
              local_2f0._16_8_ =
                   (pVVar27->super_LoggerImpl).mErrors.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
              local_2f0._0_8_ = (ValidatorImpl *)*plVar7;
            }
            local_2f0._8_8_ = plVar7[1];
            *plVar7 = (long)pVVar27;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            Issue::IssueImpl::setDescription(pIVar1,(string *)local_2f0);
            if ((ValidatorImpl *)local_2f0._0_8_ != (ValidatorImpl *)(local_2f0 + 0x10)) {
              operator_delete((void *)local_2f0._0_8_,(ulong)(local_2f0._16_8_ + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
              operator_delete(local_2c8._M_dataplus._M_p,
                              (ulong)(local_2c8.field_2._M_allocated_capacity + 1));
            }
            if ((ValidatorImpl *)local_288._0_8_ != (ValidatorImpl *)(local_288 + 0x10)) {
              operator_delete((void *)local_288._0_8_,(ulong)(local_288._16_8_ + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_258._24_8_ != &local_230) {
              operator_delete((void *)local_258._24_8_,local_230._M_allocated_capacity + 1);
            }
            Logger::LoggerImpl::addIssue(&local_1c0->super_LoggerImpl,&local_268);
            if (local_268.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_268.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
          }
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_2f0," - variable equivalence ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_320 + 0x10));
          std::__cxx11::string::operator=((string *)&local_220,(string *)local_2f0);
          pVVar27 = (ValidatorImpl *)local_2f0._0_8_;
          if ((ValidatorImpl *)local_2f0._0_8_ != (ValidatorImpl *)(local_2f0 + 0x10)) {
            operator_delete((void *)local_2f0._0_8_,(ulong)(local_2f0._16_8_ + 1));
          }
          pIVar14 = (IdMap *)local_258._16_8_;
          addIdMapItem(pVVar27,(string *)local_330,&local_220,(IdMap *)local_258._16_8_);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_320._16_8_ != &local_300) {
            operator_delete((void *)local_320._16_8_,(ulong)(local_300._M_allocated_capacity + 1));
          }
        }
        Variable::equivalenceConnectionId_abi_cxx11_
                  ((string *)(local_320 + 0x10),(Variable *)local_1b8,(VariablePtr *)local_168,
                   (VariablePtr *)pIVar14);
        NamedEntity::name_abi_cxx11_
                  (&local_2c8,
                   (NamedEntity *)
                   ((__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> *)
                   &local_2d0->super_Logger)->_M_ptr);
        NamedEntity::name_abi_cxx11_
                  ((string *)local_288,
                   (NamedEntity *)
                   local_110.
                   super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
        uVar24 = local_288._8_8_;
        sVar2 = local_2c8._M_string_length;
        p_Var21 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2c8._M_string_length;
        if ((ulong)local_288._8_8_ < local_2c8._M_string_length) {
          p_Var21 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_;
        }
        if (p_Var21 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          iVar6 = 0;
        }
        else {
          iVar6 = memcmp(local_2c8._M_dataplus._M_p,(void *)local_288._0_8_,(size_t)p_Var21);
        }
        if (iVar6 == 0) {
          lVar22 = sVar2 - uVar24;
          if (lVar22 < -0x7fffffff) {
            lVar22 = -0x80000000;
          }
          if (0x7ffffffe < lVar22) {
            lVar22 = 0x7fffffff;
          }
          iVar6 = (int)lVar22;
        }
        if (iVar6 < 0) {
          NamedEntity::name_abi_cxx11_
                    (&local_60,
                     (NamedEntity *)
                     ((__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> *)
                     &local_2d0->super_Logger)->_M_ptr);
          NamedEntity::name_abi_cxx11_
                    (&local_a0,
                     (NamedEntity *)
                     local_110.
                     super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr);
          uVar24 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60._M_dataplus._M_p != &local_60.field_2) {
            uVar24 = local_60.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar24 < local_a0._M_string_length + local_60._M_string_length) {
            uVar24 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
              uVar24 = local_a0.field_2._M_allocated_capacity;
            }
            if (local_a0._M_string_length + local_60._M_string_length <= (ulong)uVar24) {
              plVar7 = (long *)std::__cxx11::string::replace
                                         ((ulong)&local_a0,0,(char *)0x0,
                                          (ulong)local_60._M_dataplus._M_p);
              goto LAB_0028be15;
            }
          }
          plVar7 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_60,(ulong)local_a0._M_dataplus._M_p);
        }
        else {
          NamedEntity::name_abi_cxx11_
                    (&local_80,
                     (NamedEntity *)
                     local_110.
                     super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr);
          NamedEntity::name_abi_cxx11_
                    (&local_c0,
                     (NamedEntity *)
                     ((__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> *)
                     &local_2d0->super_Logger)->_M_ptr);
          uVar24 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != &local_80.field_2) {
            uVar24 = local_80.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar24 < local_c0._M_string_length + local_80._M_string_length) {
            uVar24 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
              uVar24 = local_c0.field_2._M_allocated_capacity;
            }
            if (local_c0._M_string_length + local_80._M_string_length <= (ulong)uVar24) {
              plVar7 = (long *)std::__cxx11::string::replace
                                         ((ulong)&local_c0,0,(char *)0x0,
                                          (ulong)local_80._M_dataplus._M_p);
              goto LAB_0028be15;
            }
          }
          plVar7 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_80,(ulong)local_c0._M_dataplus._M_p);
        }
LAB_0028be15:
        local_2f0._0_8_ = local_2f0 + 0x10;
        pVVar27 = (ValidatorImpl *)(plVar7 + 2);
        if ((ValidatorImpl *)*plVar7 == pVVar27) {
          local_2f0._16_8_ =
               (pVVar27->super_LoggerImpl).mErrors.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_2f0._24_8_ = plVar7[3];
        }
        else {
          local_2f0._16_8_ =
               (pVVar27->super_LoggerImpl).mErrors.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_2f0._0_8_ = (ValidatorImpl *)*plVar7;
        }
        local_2f0._8_8_ = plVar7[1];
        *plVar7 = (long)pVVar27;
        plVar7[1] = 0;
        *(undefined1 *)
         &(pVVar27->super_LoggerImpl).mErrors.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = 0;
        if (iVar6 < 0) {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
          }
          uVar24 = local_60.field_2._M_allocated_capacity;
          _Var28._M_p = local_60._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60._M_dataplus._M_p != &local_60.field_2) goto LAB_0028bef1;
        }
        else {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
            operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
          }
          uVar24 = local_80.field_2._M_allocated_capacity;
          _Var28._M_p = local_80._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != &local_80.field_2) {
LAB_0028bef1:
            operator_delete(_Var28._M_p,uVar24 + 1);
          }
        }
        if ((ValidatorImpl *)local_288._0_8_ != (ValidatorImpl *)(local_288 + 0x10)) {
          operator_delete((void *)local_288._0_8_,(ulong)(local_288._16_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
          operator_delete(local_2c8._M_dataplus._M_p,
                          (ulong)(local_2c8.field_2._M_allocated_capacity + 1));
        }
        uVar3 = local_2a8._8_8_;
        uVar24 = local_350._8_8_;
        p_Var21 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a8._8_8_;
        if ((ulong)local_350._8_8_ < (ulong)local_2a8._8_8_) {
          p_Var21 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_350._8_8_;
        }
        if (p_Var21 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          iVar6 = 0;
        }
        else {
          iVar6 = memcmp((void *)local_2a8._0_8_,(void *)local_350._0_8_,(size_t)p_Var21);
        }
        if (iVar6 == 0) {
          lVar22 = uVar3 - uVar24;
          if (lVar22 < -0x7fffffff) {
            lVar22 = -0x80000000;
          }
          if (0x7ffffffe < lVar22) {
            lVar22 = 0x7fffffff;
          }
          iVar6 = (int)lVar22;
        }
        if (((iVar6 < 0) && (local_308 != (_Base_ptr)0x0)) &&
           (cVar10 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_138,(key_type *)local_2f0), cVar10._M_node == local_38)) {
          NamedEntity::name_abi_cxx11_
                    (&local_130,
                     (NamedEntity *)
                     ((__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> *)
                     &local_2d0->super_Logger)->_M_ptr);
          plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_130,0,(char *)0x0,0x2b73db);
          local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
          puVar16 = (ulong *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar16) {
            local_188.field_2._M_allocated_capacity = *puVar16;
            local_188.field_2._8_8_ = plVar7[3];
          }
          else {
            local_188.field_2._M_allocated_capacity = *puVar16;
            local_188._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_188._M_string_length = plVar7[1];
          *plVar7 = (long)puVar16;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_188);
          local_168._16_8_ = &local_148;
          paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 == paVar11) {
            local_148._M_allocated_capacity = paVar11->_M_allocated_capacity;
            local_148._8_8_ = plVar7[3];
          }
          else {
            local_148._M_allocated_capacity = paVar11->_M_allocated_capacity;
            local_168._16_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*plVar7;
          }
          local_150._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar7[1];
          *plVar7 = (long)paVar11;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          NamedEntity::name_abi_cxx11_
                    ((string *)(local_1b8 + 0x10),
                     (NamedEntity *)
                     local_110.
                     super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr);
          uVar24 = (element_type *)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_168._16_8_ != &local_148) {
            uVar24 = local_148._M_allocated_capacity;
          }
          peVar18 = (element_type *)
                    ((long)&(local_150._M_pi)->_vptr__Sp_counted_base +
                    (long)&(local_1a0._M_pi)->_vptr__Sp_counted_base);
          if ((ulong)uVar24 < peVar18) {
            uVar24 = (element_type *)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1b8._16_8_ != &local_198) {
              uVar24 = local_198._M_allocated_capacity;
            }
            if ((ulong)uVar24 < peVar18) goto LAB_0028c144;
            plVar7 = (long *)std::__cxx11::string::replace
                                       ((ulong)(local_1b8 + 0x10),0,(char *)0x0,local_168._16_8_);
          }
          else {
LAB_0028c144:
            plVar7 = (long *)std::__cxx11::string::_M_append(local_168 + 0x10,local_1b8._16_8_);
          }
          local_1e0.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               &local_1d0;
          peVar15 = (element_type *)(plVar7 + 2);
          if ((element_type *)*plVar7 == peVar15) {
            local_1d0._vptr_Issue = peVar15->_vptr_Issue;
            local_1d0.mPimpl = (IssueImpl *)plVar7[3];
          }
          else {
            local_1d0._vptr_Issue = peVar15->_vptr_Issue;
            local_1e0.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)*plVar7;
          }
          local_1e0.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar7[1];
          *plVar7 = (long)peVar15;
          plVar7[1] = 0;
          *(undefined1 *)&peVar15->_vptr_Issue = 0;
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_1e0);
          local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
          puVar16 = (ulong *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar16) {
            local_200.field_2._M_allocated_capacity = *puVar16;
            local_200.field_2._8_8_ = plVar7[3];
          }
          else {
            local_200.field_2._M_allocated_capacity = *puVar16;
            local_200._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_200._M_string_length = plVar7[1];
          *plVar7 = (long)puVar16;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          NamedEntity::name_abi_cxx11_(&local_e0,(NamedEntity *)local_1b8._0_8_);
          uVar24 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_200._M_dataplus._M_p != &local_200.field_2) {
            uVar24 = local_200.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar24 < local_e0._M_string_length + local_200._M_string_length) {
            uVar24 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
              uVar24 = local_e0.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar24 < local_e0._M_string_length + local_200._M_string_length)
            goto LAB_0028c2a0;
            plVar7 = (long *)std::__cxx11::string::replace
                                       ((ulong)&local_e0,0,(char *)0x0,
                                        (ulong)local_200._M_dataplus._M_p);
          }
          else {
LAB_0028c2a0:
            plVar7 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_200,(ulong)local_e0._M_dataplus._M_p);
          }
          local_268.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)local_258;
          peVar18 = (element_type *)(plVar7 + 2);
          if ((element_type *)*plVar7 == peVar18) {
            local_258._0_8_ =
                 (peVar18->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.
                 super_Entity._vptr_Entity;
            local_258._8_8_ = plVar7[3];
          }
          else {
            local_258._0_8_ =
                 (peVar18->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.
                 super_Entity._vptr_Entity;
            local_268.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)*plVar7;
          }
          local_268.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar7[1];
          *plVar7 = (long)peVar18;
          plVar7[1] = 0;
          *(undefined1 *)
           &(peVar18->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.
            _vptr_Entity = 0;
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_268);
          local_258._24_8_ = &local_230;
          paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 == paVar11) {
            local_230._M_allocated_capacity = paVar11->_M_allocated_capacity;
            local_230._8_8_ = plVar7[3];
          }
          else {
            local_230._M_allocated_capacity = paVar11->_M_allocated_capacity;
            local_258._24_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*plVar7;
          }
          local_238 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar7[1];
          *plVar7 = (long)paVar11;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          NamedEntity::name_abi_cxx11_(&local_100,(NamedEntity *)local_168._0_8_);
          uVar24 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_258._24_8_ != &local_230) {
            uVar24 = local_230._M_allocated_capacity;
          }
          uVar19 = (long)&local_238->_vptr__Sp_counted_base + local_100._M_string_length;
          if ((ulong)uVar24 < uVar19) {
            uVar24 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_100._M_dataplus._M_p != &local_100.field_2) {
              uVar24 = local_100.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar24 < uVar19) goto LAB_0028c3fc;
            plVar7 = (long *)std::__cxx11::string::replace
                                       ((ulong)&local_100,0,(char *)0x0,local_258._24_8_);
          }
          else {
LAB_0028c3fc:
            plVar7 = (long *)std::__cxx11::string::_M_append
                                       (local_258 + 0x18,(ulong)local_100._M_dataplus._M_p);
          }
          local_288._0_8_ = local_288 + 0x10;
          pVVar27 = (ValidatorImpl *)(plVar7 + 2);
          if ((ValidatorImpl *)*plVar7 == pVVar27) {
            local_288._16_8_ =
                 (pVVar27->super_LoggerImpl).mErrors.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
            local_288._24_8_ = plVar7[3];
          }
          else {
            local_288._16_8_ =
                 (pVVar27->super_LoggerImpl).mErrors.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
            local_288._0_8_ = (ValidatorImpl *)*plVar7;
          }
          local_288._8_8_ = plVar7[1];
          *plVar7 = (long)pVVar27;
          plVar7[1] = 0;
          *(undefined1 *)
           &(pVVar27->super_LoggerImpl).mErrors.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start = 0;
          plVar7 = (long *)std::__cxx11::string::append(local_288);
          local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
          plVar17 = plVar7 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)plVar17) {
            local_2c8.field_2._M_allocated_capacity = *plVar17;
            local_2c8.field_2._8_8_ = plVar7[3];
          }
          else {
            local_2c8.field_2._M_allocated_capacity = *plVar17;
            local_2c8._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_2c8._M_string_length = plVar7[1];
          *plVar7 = (long)plVar17;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          if ((ValidatorImpl *)local_288._0_8_ != (ValidatorImpl *)(local_288 + 0x10)) {
            operator_delete((void *)local_288._0_8_,(ulong)(local_288._16_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100._M_dataplus._M_p != &local_100.field_2) {
            operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_258._24_8_ != &local_230) {
            operator_delete((void *)local_258._24_8_,local_230._M_allocated_capacity + 1);
          }
          if ((element_type *)
              local_268.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)local_258) {
            operator_delete(local_268.
                            super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                            (ulong)((long)&((__shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                                             *)local_258._0_8_)->_M_ptr + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
            operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_200._M_dataplus._M_p != &local_200.field_2) {
            operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
          }
          if (local_1e0.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              &local_1d0) {
            operator_delete(local_1e0.
                            super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                            (long)local_1d0._vptr_Issue + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b8._16_8_ != &local_198) {
            operator_delete((void *)local_1b8._16_8_,(ulong)(local_198._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_168._16_8_ != &local_148) {
            operator_delete((void *)local_168._16_8_,(ulong)(local_148._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p != &local_188.field_2) {
            operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130._M_dataplus._M_p != &local_130.field_2) {
            operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
          }
          bVar5 = isValidXmlName((string *)(local_320 + 0x10));
          if (!bVar5) {
            Issue::IssueImpl::create();
            Issue::IssueImpl::setReferenceRule
                      ((local_1e0.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->mPimpl,XML_ID_ATTRIBUTE);
            AnyCellmlElement::AnyCellmlElementImpl::setConnection
                      ((((local_1e0.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->mPimpl->mItem).
                        super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->mPimpl,(VariablePtr *)local_1b8,(VariablePtr *)local_168);
            pIVar1 = (local_1e0.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->mPimpl;
            std::operator+(&local_200,"Connection ",&local_2c8);
            plVar7 = (long *)std::__cxx11::string::append((char *)&local_200);
            local_268.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)local_258;
            peVar18 = (element_type *)(plVar7 + 2);
            if ((element_type *)*plVar7 == peVar18) {
              local_258._0_8_ =
                   (peVar18->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.
                   super_Entity._vptr_Entity;
              local_258._8_8_ = plVar7[3];
            }
            else {
              local_258._0_8_ =
                   (peVar18->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.
                   super_Entity._vptr_Entity;
              local_268.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)*plVar7;
            }
            local_268.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar7[1];
            *plVar7 = (long)peVar18;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_268,local_320._16_8_);
            local_258._24_8_ = &local_230;
            paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(plVar7 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar7 == paVar11) {
              local_230._M_allocated_capacity = paVar11->_M_allocated_capacity;
              local_230._8_8_ = plVar7[3];
            }
            else {
              local_230._M_allocated_capacity = paVar11->_M_allocated_capacity;
              local_258._24_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*plVar7;
            }
            local_238 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar7[1];
            *plVar7 = (long)paVar11;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            plVar7 = (long *)std::__cxx11::string::append(local_258 + 0x18);
            local_288._0_8_ = local_288 + 0x10;
            pVVar27 = (ValidatorImpl *)(plVar7 + 2);
            if ((ValidatorImpl *)*plVar7 == pVVar27) {
              local_288._16_8_ =
                   (pVVar27->super_LoggerImpl).mErrors.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
              local_288._24_8_ = plVar7[3];
            }
            else {
              local_288._16_8_ =
                   (pVVar27->super_LoggerImpl).mErrors.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
              local_288._0_8_ = (ValidatorImpl *)*plVar7;
            }
            local_288._8_8_ = plVar7[1];
            *plVar7 = (long)pVVar27;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            Issue::IssueImpl::setDescription(pIVar1,(string *)local_288);
            if ((ValidatorImpl *)local_288._0_8_ != (ValidatorImpl *)(local_288 + 0x10)) {
              operator_delete((void *)local_288._0_8_,(ulong)(local_288._16_8_ + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_258._24_8_ != &local_230) {
              operator_delete((void *)local_258._24_8_,local_230._M_allocated_capacity + 1);
            }
            if ((element_type *)
                local_268.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                (element_type *)local_258) {
              operator_delete(local_268.
                              super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr,(ulong)((long)&((
                                                  __shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                                                  *)local_258._0_8_)->_M_ptr + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_200._M_dataplus._M_p != &local_200.field_2) {
              operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1
                             );
            }
            Logger::LoggerImpl::addIssue(&local_1c0->super_LoggerImpl,&local_1e0);
            if (local_1e0.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_1e0.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
          }
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    (local_138,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f0)
          ;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_288," - connection ",&local_2c8);
          std::__cxx11::string::operator=((string *)&local_220,(string *)local_288);
          pVVar27 = (ValidatorImpl *)local_288._0_8_;
          if ((ValidatorImpl *)local_288._0_8_ != (ValidatorImpl *)(local_288 + 0x10)) {
            operator_delete((void *)local_288._0_8_,(ulong)(local_288._16_8_ + 1));
          }
          addIdMapItem(pVVar27,(string *)(local_320 + 0x10),&local_220,(IdMap *)local_258._16_8_);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
            operator_delete(local_2c8._M_dataplus._M_p,
                            (ulong)(local_2c8.field_2._M_allocated_capacity + 1));
          }
        }
        if ((ValidatorImpl *)local_2f0._0_8_ != (ValidatorImpl *)(local_2f0 + 0x10)) {
          operator_delete((void *)local_2f0._0_8_,(ulong)(local_2f0._16_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_320._16_8_ != &local_300) {
          operator_delete((void *)local_320._16_8_,(ulong)(local_300._M_allocated_capacity + 1));
        }
        if ((_Base_ptr)local_330._0_8_ != (_Base_ptr)local_320) {
          operator_delete((void *)local_330._0_8_,(ulong)(local_320._0_8_ + 1));
        }
        if ((IdMap *)local_350._0_8_ != (IdMap *)local_340) {
          operator_delete((void *)local_350._0_8_,(ulong)(local_340._0_8_ + 1));
        }
        if ((NamedEntity *)local_2a8._0_8_ != (NamedEntity *)(local_2a8 + 0x10)) {
          operator_delete((void *)local_2a8._0_8_,local_2a8._16_8_ + 1);
        }
      }
      if (local_110.super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_110.
                   super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_);
      }
      uVar29 = uVar29 + 1;
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_);
    }
    uVar29 = local_40 + 1;
  }
  uVar29 = 0;
  while( true ) {
    pcVar31 = local_2a8 + 0x10;
    sVar9 = Component::resetCount
                      (((__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> *)
                       &local_2d0->super_Logger)->_M_ptr);
    if (sVar9 <= uVar29) break;
    Component::reset((Component *)local_288,
                     (size_t)((__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> *)
                             &local_2d0->super_Logger)->_M_ptr);
    Entity::id_abi_cxx11_((string *)local_2a8,(Entity *)local_288._0_8_);
    uVar24 = local_2a8._8_8_;
    if ((NamedEntity *)local_2a8._0_8_ != (NamedEntity *)(local_2a8 + 0x10)) {
      operator_delete((void *)local_2a8._0_8_,local_2a8._16_8_ + 1);
    }
    pNVar30 = (NamedEntity *)(local_2a8 + 0x10);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar24 !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      cVar23 = '\x01';
      if (9 < uVar29) {
        uVar19 = uVar29;
        cVar4 = '\x04';
        do {
          cVar23 = cVar4;
          if (uVar19 < 100) {
            cVar23 = cVar23 + -2;
            goto LAB_0028cb75;
          }
          if (uVar19 < 1000) {
            cVar23 = cVar23 + -1;
            goto LAB_0028cb75;
          }
          if (uVar19 < 10000) goto LAB_0028cb75;
          bVar5 = 99999 < uVar19;
          uVar19 = uVar19 / 10000;
          cVar4 = cVar23 + '\x04';
        } while (bVar5);
        cVar23 = cVar23 + '\x01';
      }
LAB_0028cb75:
      local_2f0._0_8_ = local_2f0 + 0x10;
      std::__cxx11::string::_M_construct((ulong)local_2f0,cVar23);
      std::__detail::__to_chars_10_impl<unsigned_long>
                ((char *)local_2f0._0_8_,local_2f0._8_4_,uVar29);
      puVar8 = (undefined8 *)std::__cxx11::string::replace((ulong)local_2f0,0,(char *)0x0,0x2b7476);
      local_320._16_8_ = &local_300;
      paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar8 == paVar11) {
        local_300._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_300._8_8_ = puVar8[3];
      }
      else {
        local_300._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_320._16_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*puVar8;
      }
      local_308 = (_Base_ptr)puVar8[1];
      *puVar8 = paVar11;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append(local_320 + 0x10);
      local_330._0_8_ = local_320;
      p_Var25 = (_Base_ptr)(plVar7 + 2);
      if ((_Base_ptr)*plVar7 == p_Var25) {
        local_320._0_8_ = *(undefined8 *)p_Var25;
        local_320._8_8_ = plVar7[3];
      }
      else {
        local_320._0_8_ = *(undefined8 *)p_Var25;
        local_330._0_8_ = (_Base_ptr)*plVar7;
      }
      local_330._8_8_ = plVar7[1];
      *plVar7 = (long)p_Var25;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      NamedEntity::name_abi_cxx11_
                (&local_2c8,
                 (NamedEntity *)
                 ((__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> *)
                 &local_2d0->super_Logger)->_M_ptr);
      p_Var25 = (_Base_ptr)0xf;
      if ((_Base_ptr)local_330._0_8_ != (_Base_ptr)local_320) {
        p_Var25 = (_Base_ptr)local_320._0_8_;
      }
      p_Var26 = (_Base_ptr)
                ((long)(_func_int ***)local_330._8_8_ +
                (long)(_func_int ***)local_2c8._M_string_length);
      if (p_Var25 < p_Var26) {
        uVar24 = (_Base_ptr)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
          uVar24 = local_2c8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar24 < p_Var26) goto LAB_0028ccbd;
        plVar7 = (long *)std::__cxx11::string::replace
                                   ((ulong)&local_2c8,0,(char *)0x0,local_330._0_8_);
      }
      else {
LAB_0028ccbd:
        plVar7 = (long *)std::__cxx11::string::_M_append
                                   (local_330,(ulong)local_2c8._M_dataplus._M_p);
      }
      local_350._0_8_ = local_340;
      pIVar14 = (IdMap *)(plVar7 + 2);
      if ((IdMap *)*plVar7 == pIVar14) {
        local_340._0_8_ = *(undefined8 *)&(pIVar14->_M_t)._M_impl;
        local_340._8_8_ = plVar7[3];
      }
      else {
        local_340._0_8_ = *(undefined8 *)&(pIVar14->_M_t)._M_impl;
        local_350._0_8_ = (IdMap *)*plVar7;
      }
      local_350._8_8_ = plVar7[1];
      *plVar7 = (long)pIVar14;
      plVar7[1] = 0;
      *(undefined1 *)&(pIVar14->_M_t)._M_impl = 0;
      plVar7 = (long *)std::__cxx11::string::append(local_350);
      pNVar13 = (NamedEntity *)(plVar7 + 2);
      if ((NamedEntity *)*plVar7 == pNVar13) {
        local_2a8._16_8_ = (pNVar13->super_ParentedEntity).super_Entity._vptr_Entity;
        local_2a8._24_8_ = plVar7[3];
        local_2a8._0_8_ = pNVar30;
      }
      else {
        local_2a8._16_8_ = (pNVar13->super_ParentedEntity).super_Entity._vptr_Entity;
        local_2a8._0_8_ = (NamedEntity *)*plVar7;
      }
      local_2a8._8_8_ = plVar7[1];
      *plVar7 = (long)pNVar13;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_220,(string *)local_2a8);
      if ((NamedEntity *)local_2a8._0_8_ != pNVar30) {
        operator_delete((void *)local_2a8._0_8_,local_2a8._16_8_ + 1);
      }
      if ((IdMap *)local_350._0_8_ != (IdMap *)local_340) {
        operator_delete((void *)local_350._0_8_,(ulong)(local_340._0_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
        operator_delete(local_2c8._M_dataplus._M_p,
                        (ulong)(local_2c8.field_2._M_allocated_capacity + 1));
      }
      if ((_Base_ptr)local_330._0_8_ != (_Base_ptr)local_320) {
        operator_delete((void *)local_330._0_8_,(ulong)(local_320._0_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_320._16_8_ != &local_300) {
        operator_delete((void *)local_320._16_8_,(ulong)(local_300._M_allocated_capacity + 1));
      }
      if ((ValidatorImpl *)local_2f0._0_8_ != (ValidatorImpl *)(local_2f0 + 0x10)) {
        operator_delete((void *)local_2f0._0_8_,(ulong)(local_2f0._16_8_ + 1));
      }
      pVVar27 = (ValidatorImpl *)local_2a8;
      Entity::id_abi_cxx11_((string *)local_2a8,(Entity *)local_288._0_8_);
      addIdMapItem(pVVar27,(string *)local_2a8,&local_220,(IdMap *)local_258._16_8_);
      if ((NamedEntity *)local_2a8._0_8_ != pNVar30) {
        operator_delete((void *)local_2a8._0_8_,local_2a8._16_8_ + 1);
      }
    }
    Reset::testValueId_abi_cxx11_((string *)local_2a8,(Reset *)local_288._0_8_);
    uVar24 = local_2a8._8_8_;
    if ((NamedEntity *)local_2a8._0_8_ != (NamedEntity *)(local_2a8 + 0x10)) {
      operator_delete((void *)local_2a8._0_8_,local_2a8._16_8_ + 1);
    }
    pNVar30 = (NamedEntity *)(local_2a8 + 0x10);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar24 !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      cVar23 = '\x01';
      if (9 < uVar29) {
        uVar19 = uVar29;
        cVar4 = '\x04';
        do {
          cVar23 = cVar4;
          if (uVar19 < 100) {
            cVar23 = cVar23 + -2;
            goto LAB_0028cf24;
          }
          if (uVar19 < 1000) {
            cVar23 = cVar23 + -1;
            goto LAB_0028cf24;
          }
          if (uVar19 < 10000) goto LAB_0028cf24;
          bVar5 = 99999 < uVar19;
          uVar19 = uVar19 / 10000;
          cVar4 = cVar23 + '\x04';
        } while (bVar5);
        cVar23 = cVar23 + '\x01';
      }
LAB_0028cf24:
      local_2f0._0_8_ = local_2f0 + 0x10;
      std::__cxx11::string::_M_construct((ulong)local_2f0,cVar23);
      std::__detail::__to_chars_10_impl<unsigned_long>
                ((char *)local_2f0._0_8_,local_2f0._8_4_,uVar29);
      puVar8 = (undefined8 *)std::__cxx11::string::replace((ulong)local_2f0,0,(char *)0x0,0x2b7489);
      local_320._16_8_ = &local_300;
      paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar8 == paVar11) {
        local_300._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_300._8_8_ = puVar8[3];
      }
      else {
        local_300._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_320._16_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*puVar8;
      }
      local_308 = (_Base_ptr)puVar8[1];
      *puVar8 = paVar11;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append(local_320 + 0x10);
      local_330._0_8_ = local_320;
      p_Var25 = (_Base_ptr)(plVar7 + 2);
      if ((_Base_ptr)*plVar7 == p_Var25) {
        local_320._0_8_ = *(undefined8 *)p_Var25;
        local_320._8_8_ = plVar7[3];
      }
      else {
        local_320._0_8_ = *(undefined8 *)p_Var25;
        local_330._0_8_ = (_Base_ptr)*plVar7;
      }
      local_330._8_8_ = plVar7[1];
      *plVar7 = (long)p_Var25;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      NamedEntity::name_abi_cxx11_
                (&local_2c8,
                 (NamedEntity *)
                 ((__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> *)
                 &local_2d0->super_Logger)->_M_ptr);
      p_Var25 = (_Base_ptr)0xf;
      if ((_Base_ptr)local_330._0_8_ != (_Base_ptr)local_320) {
        p_Var25 = (_Base_ptr)local_320._0_8_;
      }
      p_Var26 = (_Base_ptr)
                ((long)(_func_int ***)local_330._8_8_ +
                (long)(_func_int ***)local_2c8._M_string_length);
      if (p_Var25 < p_Var26) {
        uVar24 = (_Base_ptr)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
          uVar24 = local_2c8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar24 < p_Var26) goto LAB_0028d06c;
        plVar7 = (long *)std::__cxx11::string::replace
                                   ((ulong)&local_2c8,0,(char *)0x0,local_330._0_8_);
      }
      else {
LAB_0028d06c:
        plVar7 = (long *)std::__cxx11::string::_M_append
                                   (local_330,(ulong)local_2c8._M_dataplus._M_p);
      }
      local_350._0_8_ = local_340;
      pIVar14 = (IdMap *)(plVar7 + 2);
      if ((IdMap *)*plVar7 == pIVar14) {
        local_340._0_8_ = *(undefined8 *)&(pIVar14->_M_t)._M_impl;
        local_340._8_8_ = plVar7[3];
      }
      else {
        local_340._0_8_ = *(undefined8 *)&(pIVar14->_M_t)._M_impl;
        local_350._0_8_ = (IdMap *)*plVar7;
      }
      local_350._8_8_ = plVar7[1];
      *plVar7 = (long)pIVar14;
      plVar7[1] = 0;
      *(undefined1 *)&(pIVar14->_M_t)._M_impl = 0;
      plVar7 = (long *)std::__cxx11::string::append(local_350);
      pNVar13 = (NamedEntity *)(plVar7 + 2);
      if ((NamedEntity *)*plVar7 == pNVar13) {
        local_2a8._16_8_ = (pNVar13->super_ParentedEntity).super_Entity._vptr_Entity;
        local_2a8._24_8_ = plVar7[3];
        local_2a8._0_8_ = pNVar30;
      }
      else {
        local_2a8._16_8_ = (pNVar13->super_ParentedEntity).super_Entity._vptr_Entity;
        local_2a8._0_8_ = (NamedEntity *)*plVar7;
      }
      local_2a8._8_8_ = plVar7[1];
      *plVar7 = (long)pNVar13;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_220,(string *)local_2a8);
      if ((NamedEntity *)local_2a8._0_8_ != pNVar30) {
        operator_delete((void *)local_2a8._0_8_,local_2a8._16_8_ + 1);
      }
      if ((IdMap *)local_350._0_8_ != (IdMap *)local_340) {
        operator_delete((void *)local_350._0_8_,(ulong)(local_340._0_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
        operator_delete(local_2c8._M_dataplus._M_p,
                        (ulong)(local_2c8.field_2._M_allocated_capacity + 1));
      }
      if ((_Base_ptr)local_330._0_8_ != (_Base_ptr)local_320) {
        operator_delete((void *)local_330._0_8_,(ulong)(local_320._0_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_320._16_8_ != &local_300) {
        operator_delete((void *)local_320._16_8_,(ulong)(local_300._M_allocated_capacity + 1));
      }
      if ((undefined1 *)local_2f0._0_8_ != local_2f0 + 0x10) {
        operator_delete((void *)local_2f0._0_8_,(ulong)(local_2f0._16_8_ + 1));
      }
      pVVar27 = (ValidatorImpl *)local_2a8;
      Reset::testValueId_abi_cxx11_((string *)local_2a8,(Reset *)local_288._0_8_);
      addIdMapItem(pVVar27,(string *)local_2a8,&local_220,(IdMap *)local_258._16_8_);
      if ((NamedEntity *)local_2a8._0_8_ != pNVar30) {
        operator_delete((void *)local_2a8._0_8_,local_2a8._16_8_ + 1);
      }
    }
    cVar23 = '\x01';
    if (9 < uVar29) {
      uVar19 = uVar29;
      cVar4 = '\x04';
      do {
        cVar23 = cVar4;
        if (uVar19 < 100) {
          cVar23 = cVar23 + -2;
          goto LAB_0028d285;
        }
        if (uVar19 < 1000) {
          cVar23 = cVar23 + -1;
          goto LAB_0028d285;
        }
        if (uVar19 < 10000) goto LAB_0028d285;
        bVar5 = 99999 < uVar19;
        uVar19 = uVar19 / 10000;
        cVar4 = cVar23 + '\x04';
      } while (bVar5);
      cVar23 = cVar23 + '\x01';
    }
LAB_0028d285:
    local_2f0._0_8_ = local_2f0 + 0x10;
    std::__cxx11::string::_M_construct((ulong)local_2f0,cVar23);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_2f0._0_8_,local_2f0._8_4_,uVar29)
    ;
    plVar7 = (long *)std::__cxx11::string::replace((ulong)local_2f0,0,(char *)0x0,0x2b74aa);
    local_320._16_8_ = &local_300;
    paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 == paVar11) {
      local_300._M_allocated_capacity = paVar11->_M_allocated_capacity;
      local_300._8_8_ = plVar7[3];
    }
    else {
      local_300._M_allocated_capacity = paVar11->_M_allocated_capacity;
      local_320._16_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar7;
    }
    local_308 = (_Base_ptr)plVar7[1];
    *plVar7 = (long)paVar11;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append(local_320 + 0x10);
    local_330._0_8_ = local_320;
    p_Var25 = (_Base_ptr)(plVar7 + 2);
    if ((_Base_ptr)*plVar7 == p_Var25) {
      local_320._0_8_ = *(undefined8 *)p_Var25;
      local_320._8_8_ = plVar7[3];
    }
    else {
      local_320._0_8_ = *(undefined8 *)p_Var25;
      local_330._0_8_ = (_Base_ptr)*plVar7;
    }
    local_330._8_8_ = plVar7[1];
    *plVar7 = (long)p_Var25;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    NamedEntity::name_abi_cxx11_
              (&local_2c8,
               (NamedEntity *)
               ((__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> *)
               &local_2d0->super_Logger)->_M_ptr);
    p_Var25 = (_Base_ptr)0xf;
    if ((_Base_ptr)local_330._0_8_ != (_Base_ptr)local_320) {
      p_Var25 = (_Base_ptr)local_320._0_8_;
    }
    p_Var26 = (_Base_ptr)
              ((long)(_func_int ***)local_330._8_8_ +
              (long)(_func_int ***)local_2c8._M_string_length);
    if (p_Var25 < p_Var26) {
      uVar24 = (_Base_ptr)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
        uVar24 = local_2c8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar24 < p_Var26) goto LAB_0028d3cd;
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_2c8,0,(char *)0x0,local_330._0_8_);
    }
    else {
LAB_0028d3cd:
      puVar8 = (undefined8 *)
               std::__cxx11::string::_M_append(local_330,(ulong)local_2c8._M_dataplus._M_p);
    }
    local_350._0_8_ = local_340;
    psVar20 = puVar8 + 2;
    if ((size_type *)*puVar8 == psVar20) {
      local_340._0_8_ = *psVar20;
      local_340._8_8_ = puVar8[3];
    }
    else {
      local_340._0_8_ = *psVar20;
      local_350._0_8_ = (size_type *)*puVar8;
    }
    local_350._8_8_ = puVar8[1];
    *puVar8 = psVar20;
    puVar8[1] = 0;
    *(undefined1 *)psVar20 = 0;
    plVar7 = (long *)std::__cxx11::string::append(local_350);
    pNVar13 = (NamedEntity *)(plVar7 + 2);
    if ((NamedEntity *)*plVar7 == pNVar13) {
      local_2a8._16_8_ = (pNVar13->super_ParentedEntity).super_Entity._vptr_Entity;
      local_2a8._24_8_ = plVar7[3];
      local_2a8._0_8_ = pNVar30;
    }
    else {
      local_2a8._16_8_ = (pNVar13->super_ParentedEntity).super_Entity._vptr_Entity;
      local_2a8._0_8_ = (NamedEntity *)*plVar7;
    }
    local_2a8._8_8_ = plVar7[1];
    *plVar7 = (long)pNVar13;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_220,(string *)local_2a8);
    if ((NamedEntity *)local_2a8._0_8_ != pNVar30) {
      operator_delete((void *)local_2a8._0_8_,local_2a8._16_8_ + 1);
    }
    if ((undefined1 *)local_350._0_8_ != local_340) {
      operator_delete((void *)local_350._0_8_,local_340._0_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
      operator_delete(local_2c8._M_dataplus._M_p,
                      (ulong)(local_2c8.field_2._M_allocated_capacity + 1));
    }
    if ((_Base_ptr)local_330._0_8_ != (_Base_ptr)local_320) {
      operator_delete((void *)local_330._0_8_,(ulong)(local_320._0_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._16_8_ != &local_300) {
      operator_delete((void *)local_320._16_8_,local_300._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_2f0._0_8_ != local_2f0 + 0x10) {
      operator_delete((void *)local_2f0._0_8_,(ulong)(local_2f0._16_8_ + 1));
    }
    Reset::testValue_abi_cxx11_((string *)local_2a8,(Reset *)local_288._0_8_);
    buildMathIdMap(local_1c0,&local_220,(IdMap *)local_258._16_8_,(string *)local_2a8);
    if ((NamedEntity *)local_2a8._0_8_ != pNVar30) {
      operator_delete((void *)local_2a8._0_8_,local_2a8._16_8_ + 1);
    }
    Reset::resetValueId_abi_cxx11_((string *)local_2a8,(Reset *)local_288._0_8_);
    uVar24 = local_2a8._8_8_;
    if ((NamedEntity *)local_2a8._0_8_ != (NamedEntity *)(local_2a8 + 0x10)) {
      operator_delete((void *)local_2a8._0_8_,local_2a8._16_8_ + 1);
    }
    pNVar30 = (NamedEntity *)(local_2a8 + 0x10);
    if ((pointer)uVar24 != (pointer)0x0) {
      cVar23 = '\x01';
      if (9 < uVar29) {
        uVar19 = uVar29;
        cVar4 = '\x04';
        do {
          cVar23 = cVar4;
          if (uVar19 < 100) {
            cVar23 = cVar23 + -2;
            goto LAB_0028d63c;
          }
          if (uVar19 < 1000) {
            cVar23 = cVar23 + -1;
            goto LAB_0028d63c;
          }
          if (uVar19 < 10000) goto LAB_0028d63c;
          bVar5 = 99999 < uVar19;
          uVar19 = uVar19 / 10000;
          cVar4 = cVar23 + '\x04';
        } while (bVar5);
        cVar23 = cVar23 + '\x01';
      }
LAB_0028d63c:
      local_2f0._0_8_ = local_2f0 + 0x10;
      std::__cxx11::string::_M_construct((ulong)local_2f0,cVar23);
      std::__detail::__to_chars_10_impl<unsigned_long>
                ((char *)local_2f0._0_8_,local_2f0._8_4_,uVar29);
      plVar7 = (long *)std::__cxx11::string::replace((ulong)local_2f0,0,(char *)0x0,0x2b74bf);
      local_320._16_8_ = &local_300;
      paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 == paVar11) {
        local_300._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_300._8_8_ = plVar7[3];
      }
      else {
        local_300._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_320._16_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*plVar7;
      }
      local_308 = (_Base_ptr)plVar7[1];
      *plVar7 = (long)paVar11;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append(local_320 + 0x10);
      local_330._0_8_ = local_320;
      p_Var25 = (_Base_ptr)(plVar7 + 2);
      if ((_Base_ptr)*plVar7 == p_Var25) {
        local_320._0_8_ = *(undefined8 *)p_Var25;
        local_320._8_8_ = plVar7[3];
      }
      else {
        local_320._0_8_ = *(undefined8 *)p_Var25;
        local_330._0_8_ = (_Base_ptr)*plVar7;
      }
      local_330._8_8_ = plVar7[1];
      *plVar7 = (long)p_Var25;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      NamedEntity::name_abi_cxx11_
                (&local_2c8,
                 (NamedEntity *)
                 ((__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> *)
                 &local_2d0->super_Logger)->_M_ptr);
      p_Var25 = (_Base_ptr)0xf;
      if ((_Base_ptr)local_330._0_8_ != (_Base_ptr)local_320) {
        p_Var25 = (_Base_ptr)local_320._0_8_;
      }
      p_Var26 = (_Base_ptr)
                ((long)(_func_int ***)local_330._8_8_ +
                (long)(_func_int ***)local_2c8._M_string_length);
      if (p_Var25 < p_Var26) {
        uVar24 = (_Base_ptr)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
          uVar24 = local_2c8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar24 < p_Var26) goto LAB_0028d784;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_2c8,0,(char *)0x0,local_330._0_8_);
      }
      else {
LAB_0028d784:
        puVar8 = (undefined8 *)
                 std::__cxx11::string::_M_append(local_330,(ulong)local_2c8._M_dataplus._M_p);
      }
      local_350._0_8_ = local_340;
      psVar20 = puVar8 + 2;
      if ((size_type *)*puVar8 == psVar20) {
        local_340._0_8_ = *psVar20;
        local_340._8_8_ = puVar8[3];
      }
      else {
        local_340._0_8_ = *psVar20;
        local_350._0_8_ = (size_type *)*puVar8;
      }
      local_350._8_8_ = puVar8[1];
      *puVar8 = psVar20;
      puVar8[1] = 0;
      *(undefined1 *)psVar20 = 0;
      plVar7 = (long *)std::__cxx11::string::append(local_350);
      pNVar13 = (NamedEntity *)(plVar7 + 2);
      if ((NamedEntity *)*plVar7 == pNVar13) {
        local_2a8._16_8_ = (pNVar13->super_ParentedEntity).super_Entity._vptr_Entity;
        local_2a8._24_8_ = plVar7[3];
        local_2a8._0_8_ = pNVar30;
      }
      else {
        local_2a8._16_8_ = (pNVar13->super_ParentedEntity).super_Entity._vptr_Entity;
        local_2a8._0_8_ = (NamedEntity *)*plVar7;
      }
      local_2a8._8_8_ = plVar7[1];
      *plVar7 = (long)pNVar13;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_220,(string *)local_2a8);
      if ((NamedEntity *)local_2a8._0_8_ != pNVar30) {
        operator_delete((void *)local_2a8._0_8_,local_2a8._16_8_ + 1);
      }
      if ((undefined1 *)local_350._0_8_ != local_340) {
        operator_delete((void *)local_350._0_8_,local_340._0_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
        operator_delete(local_2c8._M_dataplus._M_p,
                        (ulong)(local_2c8.field_2._M_allocated_capacity + 1));
      }
      if ((_Base_ptr)local_330._0_8_ != (_Base_ptr)local_320) {
        operator_delete((void *)local_330._0_8_,(ulong)(local_320._0_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_320._16_8_ != &local_300) {
        operator_delete((void *)local_320._16_8_,local_300._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_2f0._0_8_ != local_2f0 + 0x10) {
        operator_delete((void *)local_2f0._0_8_,(ulong)(local_2f0._16_8_ + 1));
      }
      pVVar27 = (ValidatorImpl *)local_2a8;
      Reset::resetValueId_abi_cxx11_((string *)local_2a8,(Reset *)local_288._0_8_);
      addIdMapItem(pVVar27,(string *)local_2a8,&local_220,(IdMap *)local_258._16_8_);
      if ((NamedEntity *)local_2a8._0_8_ != pNVar30) {
        operator_delete((void *)local_2a8._0_8_,local_2a8._16_8_ + 1);
      }
    }
    cVar23 = '\x01';
    if (9 < uVar29) {
      uVar19 = uVar29;
      cVar4 = '\x04';
      do {
        cVar23 = cVar4;
        if (uVar19 < 100) {
          cVar23 = cVar23 + -2;
          goto LAB_0028d99d;
        }
        if (uVar19 < 1000) {
          cVar23 = cVar23 + -1;
          goto LAB_0028d99d;
        }
        if (uVar19 < 10000) goto LAB_0028d99d;
        bVar5 = 99999 < uVar19;
        uVar19 = uVar19 / 10000;
        cVar4 = cVar23 + '\x04';
      } while (bVar5);
      cVar23 = cVar23 + '\x01';
    }
LAB_0028d99d:
    local_2f0._0_8_ = local_2f0 + 0x10;
    std::__cxx11::string::_M_construct((ulong)local_2f0,cVar23);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_2f0._0_8_,local_2f0._8_4_,uVar29)
    ;
    puVar8 = (undefined8 *)std::__cxx11::string::replace((ulong)local_2f0,0,(char *)0x0,0x2b74e1);
    local_320._16_8_ = &local_300;
    paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar8 == paVar11) {
      local_300._M_allocated_capacity = paVar11->_M_allocated_capacity;
      local_300._8_8_ = puVar8[3];
    }
    else {
      local_300._M_allocated_capacity = paVar11->_M_allocated_capacity;
      local_320._16_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*puVar8;
    }
    local_308 = (_Base_ptr)puVar8[1];
    *puVar8 = paVar11;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append(local_320 + 0x10);
    local_330._0_8_ = local_320;
    p_Var25 = (_Base_ptr)(plVar7 + 2);
    if ((_Base_ptr)*plVar7 == p_Var25) {
      local_320._0_8_ = *(undefined8 *)p_Var25;
      local_320._8_8_ = plVar7[3];
    }
    else {
      local_320._0_8_ = *(undefined8 *)p_Var25;
      local_330._0_8_ = (_Base_ptr)*plVar7;
    }
    local_330._8_8_ = plVar7[1];
    *plVar7 = (long)p_Var25;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    NamedEntity::name_abi_cxx11_
              (&local_2c8,
               (NamedEntity *)
               ((__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> *)
               &local_2d0->super_Logger)->_M_ptr);
    p_Var25 = (_Base_ptr)0xf;
    if ((_Base_ptr)local_330._0_8_ != (_Base_ptr)local_320) {
      p_Var25 = (_Base_ptr)local_320._0_8_;
    }
    p_Var26 = (_Base_ptr)
              ((long)(_func_int ***)local_330._8_8_ +
              (long)(_func_int ***)local_2c8._M_string_length);
    if (p_Var25 < p_Var26) {
      uVar24 = (_Base_ptr)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
        uVar24 = local_2c8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar24 < p_Var26) goto LAB_0028dae5;
      plVar7 = (long *)std::__cxx11::string::replace
                                 ((ulong)&local_2c8,0,(char *)0x0,local_330._0_8_);
    }
    else {
LAB_0028dae5:
      plVar7 = (long *)std::__cxx11::string::_M_append(local_330,(ulong)local_2c8._M_dataplus._M_p);
    }
    local_350._0_8_ = local_340;
    pIVar14 = (IdMap *)(plVar7 + 2);
    if ((IdMap *)*plVar7 == pIVar14) {
      local_340._0_8_ = *(undefined8 *)&(pIVar14->_M_t)._M_impl;
      local_340._8_8_ = plVar7[3];
    }
    else {
      local_340._0_8_ = *(undefined8 *)&(pIVar14->_M_t)._M_impl;
      local_350._0_8_ = (IdMap *)*plVar7;
    }
    local_350._8_8_ = plVar7[1];
    *plVar7 = (long)pIVar14;
    plVar7[1] = 0;
    *(undefined1 *)&(pIVar14->_M_t)._M_impl = 0;
    plVar7 = (long *)std::__cxx11::string::append(local_350);
    pNVar13 = (NamedEntity *)(plVar7 + 2);
    if ((NamedEntity *)*plVar7 == pNVar13) {
      local_2a8._16_8_ = (pNVar13->super_ParentedEntity).super_Entity._vptr_Entity;
      local_2a8._24_8_ = plVar7[3];
      local_2a8._0_8_ = pNVar30;
    }
    else {
      local_2a8._16_8_ = (pNVar13->super_ParentedEntity).super_Entity._vptr_Entity;
      local_2a8._0_8_ = (NamedEntity *)*plVar7;
    }
    local_2a8._8_8_ = plVar7[1];
    *plVar7 = (long)pNVar13;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_220,(string *)local_2a8);
    if ((NamedEntity *)local_2a8._0_8_ != pNVar30) {
      operator_delete((void *)local_2a8._0_8_,local_2a8._16_8_ + 1);
    }
    if ((IdMap *)local_350._0_8_ != (IdMap *)local_340) {
      operator_delete((void *)local_350._0_8_,(ulong)(local_340._0_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
      operator_delete(local_2c8._M_dataplus._M_p,
                      (ulong)(local_2c8.field_2._M_allocated_capacity + 1));
    }
    if ((_Base_ptr)local_330._0_8_ != (_Base_ptr)local_320) {
      operator_delete((void *)local_330._0_8_,(ulong)(local_320._0_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._16_8_ != &local_300) {
      operator_delete((void *)local_320._16_8_,(ulong)(local_300._M_allocated_capacity + 1));
    }
    if ((ValidatorImpl *)local_2f0._0_8_ != (ValidatorImpl *)(local_2f0 + 0x10)) {
      operator_delete((void *)local_2f0._0_8_,(ulong)(local_2f0._16_8_ + 1));
    }
    Reset::resetValue_abi_cxx11_((string *)local_2a8,(Reset *)local_288._0_8_);
    buildMathIdMap(local_1c0,&local_220,(IdMap *)local_258._16_8_,(string *)local_2a8);
    if ((NamedEntity *)local_2a8._0_8_ != pNVar30) {
      operator_delete((void *)local_2a8._0_8_,local_2a8._16_8_ + 1);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_);
    }
    uVar29 = uVar29 + 1;
  }
  NamedEntity::name_abi_cxx11_
            ((string *)local_330,
             (NamedEntity *)
             ((__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> *)
             &local_2d0->super_Logger)->_M_ptr);
  plVar7 = (long *)std::__cxx11::string::replace((ulong)local_330,0,(char *)0x0,0x2b74f7);
  local_350._0_8_ = local_340;
  psVar20 = (size_type *)(plVar7 + 2);
  if ((size_type *)*plVar7 == psVar20) {
    local_340._0_8_ = *psVar20;
    local_340._8_8_ = plVar7[3];
  }
  else {
    local_340._0_8_ = *psVar20;
    local_350._0_8_ = (size_type *)*plVar7;
  }
  local_350._8_8_ = plVar7[1];
  *plVar7 = (long)psVar20;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append(local_350);
  psVar20 = (size_type *)(plVar7 + 2);
  if ((size_type *)*plVar7 == psVar20) {
    local_2a8._16_8_ = *psVar20;
    local_2a8._24_8_ = plVar7[3];
    local_2a8._0_8_ = pcVar31;
  }
  else {
    local_2a8._16_8_ = *psVar20;
    local_2a8._0_8_ = (size_type *)*plVar7;
  }
  local_2a8._8_8_ = plVar7[1];
  *plVar7 = (long)psVar20;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  std::__cxx11::string::operator=((string *)&local_220,(string *)local_2a8);
  if ((pointer)local_2a8._0_8_ != pcVar31) {
    operator_delete((void *)local_2a8._0_8_,local_2a8._16_8_ + 1);
  }
  if ((undefined1 *)local_350._0_8_ != local_340) {
    operator_delete((void *)local_350._0_8_,local_340._0_8_ + 1);
  }
  if ((_Base_ptr)local_330._0_8_ != (_Base_ptr)local_320) {
    operator_delete((void *)local_330._0_8_,(ulong)(local_320._0_8_ + 1));
  }
  Component::math_abi_cxx11_
            ((string *)local_2a8,
             ((__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> *)
             &local_2d0->super_Logger)->_M_ptr);
  buildMathIdMap(local_1c0,&local_220,(IdMap *)local_258._16_8_,(string *)local_2a8);
  if ((pointer)local_2a8._0_8_ != pcVar31) {
    operator_delete((void *)local_2a8._0_8_,local_2a8._16_8_ + 1);
  }
  ImportedEntity::importSource
            (&((__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> *)
              &local_2d0->super_Logger)->_M_ptr->super_ImportedEntity);
  if ((pointer)local_350._0_8_ == (pointer)0x0) {
    bVar5 = false;
  }
  else {
    ImportedEntity::importSource
              (&((__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> *)
                &local_2d0->super_Logger)->_M_ptr->super_ImportedEntity);
    Entity::id_abi_cxx11_((string *)local_2a8,(Entity *)local_258._24_8_);
    bVar5 = (pointer)local_2a8._8_8_ != (pointer)0x0;
    if ((pointer)local_2a8._0_8_ != pcVar31) {
      operator_delete((void *)local_2a8._0_8_,local_2a8._16_8_ + 1);
    }
    if (local_238 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_238);
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_350._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_350._8_8_);
  }
  if (bVar5) {
    NamedEntity::name_abi_cxx11_
              ((string *)(local_320 + 0x10),
               (NamedEntity *)
               ((__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> *)
               &local_2d0->super_Logger)->_M_ptr);
    plVar7 = (long *)std::__cxx11::string::replace((ulong)(local_320 + 0x10),0,(char *)0x0,0x2b750b)
    ;
    p_Var25 = (_Base_ptr)(plVar7 + 2);
    if ((_Base_ptr)*plVar7 == p_Var25) {
      local_320._0_8_ = *(undefined8 *)p_Var25;
      local_320._8_8_ = plVar7[3];
      local_330._0_8_ = (_Base_ptr)local_320;
    }
    else {
      local_320._0_8_ = *(undefined8 *)p_Var25;
      local_330._0_8_ = (_Base_ptr)*plVar7;
    }
    local_330._8_8_ = plVar7[1];
    *plVar7 = (long)p_Var25;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append(local_330);
    psVar20 = (size_type *)(plVar7 + 2);
    if ((size_type *)*plVar7 == psVar20) {
      local_340._0_8_ = *psVar20;
      local_340._8_8_ = plVar7[3];
      local_350._0_8_ = local_340;
    }
    else {
      local_340._0_8_ = *psVar20;
      local_350._0_8_ = (size_type *)*plVar7;
    }
    local_350._8_8_ = plVar7[1];
    *plVar7 = (long)psVar20;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_220,(string *)local_350);
    if ((undefined1 *)local_350._0_8_ != local_340) {
      operator_delete((void *)local_350._0_8_,local_340._0_8_ + 1);
    }
    if ((_Base_ptr)local_330._0_8_ != (_Base_ptr)local_320) {
      operator_delete((void *)local_330._0_8_,(ulong)(local_320._0_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._16_8_ != &local_300) {
      operator_delete((void *)local_320._16_8_,(ulong)(local_300._M_allocated_capacity + 1));
    }
    ImportedEntity::importSource
              (&((__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> *)
                &local_2d0->super_Logger)->_M_ptr->super_ImportedEntity);
    pVVar27 = (ValidatorImpl *)local_350;
    Entity::id_abi_cxx11_((string *)pVVar27,(Entity *)local_330._0_8_);
    addIdMapItem(pVVar27,(string *)local_350,&local_220,(IdMap *)local_258._16_8_);
    if ((undefined1 *)local_350._0_8_ != local_340) {
      operator_delete((void *)local_350._0_8_,local_340._0_8_ + 1);
    }
    if ((_Base_ptr)local_330._8_8_ != (_Base_ptr)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_330._8_8_);
    }
  }
  ComponentEntity::encapsulationId_abi_cxx11_
            ((string *)local_350,
             &((__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> *)
              &local_2d0->super_Logger)->_M_ptr->super_ComponentEntity);
  uVar24 = local_350._8_8_;
  if ((undefined1 *)local_350._0_8_ != local_340) {
    operator_delete((void *)local_350._0_8_,local_340._0_8_ + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar24 ==
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_0028e5ba;
  ComponentEntity::encapsulationId_abi_cxx11_
            ((string *)local_350,
             &((__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> *)
              &local_2d0->super_Logger)->_M_ptr->super_ComponentEntity);
  bVar5 = isValidXmlName((string *)local_350);
  if ((undefined1 *)local_350._0_8_ != local_340) {
    operator_delete((void *)local_350._0_8_,local_340._0_8_ + 1);
  }
  if (!bVar5) {
    Issue::IssueImpl::create();
    Issue::IssueImpl::setReferenceRule
              ((IssueImpl *)
               (((ComponentEntity *)
                &(local_268.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                 ->_vptr_Issue)->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl,
               XML_ID_ATTRIBUTE);
    AnyCellmlElement::AnyCellmlElementImpl::setComponent
              (((((IssueImpl *)
                 (((ComponentEntity *)
                  &(local_268.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->_vptr_Issue)->super_NamedEntity).super_ParentedEntity.super_Entity.
                 mPimpl)->mItem).
                super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->mPimpl,(ComponentPtr *)local_2d0,COMPONENT);
    pIVar1 = (IssueImpl *)
             (((ComponentEntity *)
              &(local_268.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               _vptr_Issue)->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl;
    NamedEntity::name_abi_cxx11_
              (&local_2c8,
               (NamedEntity *)
               ((__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> *)
               &local_2d0->super_Logger)->_M_ptr);
    plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_2c8,0,(char *)0x0,0x2b6f4a);
    pVVar27 = (ValidatorImpl *)(plVar7 + 2);
    if ((ValidatorImpl *)*plVar7 == pVVar27) {
      local_2f0._16_8_ =
           (pVVar27->super_LoggerImpl).mErrors.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_2f0._24_8_ = plVar7[3];
      local_2f0._0_8_ = (ValidatorImpl *)(local_2f0 + 0x10);
    }
    else {
      local_2f0._16_8_ =
           (pVVar27->super_LoggerImpl).mErrors.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_2f0._0_8_ = (ValidatorImpl *)*plVar7;
    }
    local_2f0._8_8_ = plVar7[1];
    *plVar7 = (long)pVVar27;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    puVar8 = (undefined8 *)std::__cxx11::string::append(local_2f0);
    paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar8 == paVar11) {
      local_300._M_allocated_capacity = paVar11->_M_allocated_capacity;
      local_300._8_8_ = puVar8[3];
      local_320._16_8_ = &local_300;
    }
    else {
      local_300._M_allocated_capacity = paVar11->_M_allocated_capacity;
      local_320._16_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*puVar8;
    }
    local_308 = (_Base_ptr)puVar8[1];
    *puVar8 = paVar11;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    ComponentEntity::encapsulationId_abi_cxx11_
              ((string *)local_288,
               &((__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> *)
                &local_2d0->super_Logger)->_M_ptr->super_ComponentEntity);
    p_Var25 = (_Base_ptr)((long)&local_308->_M_color + (long)(_func_int ***)local_288._8_8_);
    uVar24 = (_Base_ptr)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._16_8_ != &local_300) {
      uVar24 = local_300._M_allocated_capacity;
    }
    if ((ulong)uVar24 < p_Var25) {
      p_Var26 = (_Base_ptr)0xf;
      if ((ValidatorImpl *)local_288._0_8_ != (ValidatorImpl *)(local_288 + 0x10)) {
        p_Var26 = (_Base_ptr)local_288._16_8_;
      }
      if (p_Var26 < p_Var25) goto LAB_0028e2b4;
      plVar7 = (long *)std::__cxx11::string::replace
                                 ((ulong)local_288,0,(char *)0x0,local_320._16_8_);
    }
    else {
LAB_0028e2b4:
      plVar7 = (long *)std::__cxx11::string::_M_append(local_320 + 0x10,local_288._0_8_);
    }
    p_Var25 = (_Base_ptr)(plVar7 + 2);
    if ((_Base_ptr)*plVar7 == p_Var25) {
      local_320._0_8_ = *(undefined8 *)p_Var25;
      local_320._8_8_ = plVar7[3];
      local_330._0_8_ = (_Base_ptr)local_320;
    }
    else {
      local_320._0_8_ = *(undefined8 *)p_Var25;
      local_330._0_8_ = (_Base_ptr)*plVar7;
    }
    local_330._8_8_ = plVar7[1];
    *plVar7 = (long)p_Var25;
    plVar7[1] = 0;
    *(undefined1 *)&p_Var25->_M_color = 0;
    plVar7 = (long *)std::__cxx11::string::append(local_330);
    local_350._0_8_ = local_340;
    psVar20 = (size_type *)(plVar7 + 2);
    if ((size_type *)*plVar7 == psVar20) {
      local_340._0_8_ = *psVar20;
      local_340._8_8_ = plVar7[3];
    }
    else {
      local_340._0_8_ = *psVar20;
      local_350._0_8_ = (size_type *)*plVar7;
    }
    local_350._8_8_ = plVar7[1];
    *plVar7 = (long)psVar20;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    Issue::IssueImpl::setDescription(pIVar1,(string *)local_350);
    if ((undefined1 *)local_350._0_8_ != local_340) {
      operator_delete((void *)local_350._0_8_,local_340._0_8_ + 1);
    }
    if ((_Base_ptr)local_330._0_8_ != (_Base_ptr)local_320) {
      operator_delete((void *)local_330._0_8_,(ulong)(local_320._0_8_ + 1));
    }
    if ((ValidatorImpl *)local_288._0_8_ != (ValidatorImpl *)(local_288 + 0x10)) {
      operator_delete((void *)local_288._0_8_,(ulong)(local_288._16_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._16_8_ != &local_300) {
      operator_delete((void *)local_320._16_8_,(ulong)(local_300._M_allocated_capacity + 1));
    }
    if ((ValidatorImpl *)local_2f0._0_8_ != (ValidatorImpl *)(local_2f0 + 0x10)) {
      operator_delete((void *)local_2f0._0_8_,(ulong)(local_2f0._16_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
      operator_delete(local_2c8._M_dataplus._M_p,
                      (ulong)(local_2c8.field_2._M_allocated_capacity + 1));
    }
    Logger::LoggerImpl::addIssue(&local_1c0->super_LoggerImpl,&local_268);
    if (local_268.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_268.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  NamedEntity::name_abi_cxx11_
            ((string *)(local_320 + 0x10),
             (NamedEntity *)
             ((__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> *)
             &local_2d0->super_Logger)->_M_ptr);
  plVar7 = (long *)std::__cxx11::string::replace((ulong)(local_320 + 0x10),0,(char *)0x0,0x2b752c);
  p_Var25 = (_Base_ptr)(plVar7 + 2);
  if ((_Base_ptr)*plVar7 == p_Var25) {
    local_320._0_8_ = *(undefined8 *)p_Var25;
    local_320._8_8_ = plVar7[3];
    local_330._0_8_ = (_Base_ptr)local_320;
  }
  else {
    local_320._0_8_ = *(undefined8 *)p_Var25;
    local_330._0_8_ = (_Base_ptr)*plVar7;
  }
  local_330._8_8_ = plVar7[1];
  *plVar7 = (long)p_Var25;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append(local_330);
  psVar20 = (size_type *)(plVar7 + 2);
  if ((size_type *)*plVar7 == psVar20) {
    local_340._0_8_ = *psVar20;
    local_340._8_8_ = plVar7[3];
    local_350._0_8_ = local_340;
  }
  else {
    local_340._0_8_ = *psVar20;
    local_350._0_8_ = (size_type *)*plVar7;
  }
  local_350._8_8_ = plVar7[1];
  *plVar7 = (long)psVar20;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  std::__cxx11::string::operator=((string *)&local_220,(string *)local_350);
  if ((undefined1 *)local_350._0_8_ != local_340) {
    operator_delete((void *)local_350._0_8_,local_340._0_8_ + 1);
  }
  if ((_Base_ptr)local_330._0_8_ != (_Base_ptr)local_320) {
    operator_delete((void *)local_330._0_8_,(ulong)(local_320._0_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._16_8_ != &local_300) {
    operator_delete((void *)local_320._16_8_,(ulong)(local_300._M_allocated_capacity + 1));
  }
  pVVar27 = (ValidatorImpl *)local_350;
  ComponentEntity::encapsulationId_abi_cxx11_
            ((string *)pVVar27,
             &((__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> *)
              &local_2d0->super_Logger)->_M_ptr->super_ComponentEntity);
  addIdMapItem(pVVar27,(string *)local_350,&local_220,(IdMap *)local_258._16_8_);
  if ((undefined1 *)local_350._0_8_ != local_340) {
    operator_delete((void *)local_350._0_8_,local_340._0_8_ + 1);
  }
LAB_0028e5ba:
  for (uVar29 = 0;
      sVar9 = ComponentEntity::componentCount
                        (&((__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> *)
                          &local_2d0->super_Logger)->_M_ptr->super_ComponentEntity), uVar29 < sVar9;
      uVar29 = uVar29 + 1) {
    ComponentEntity::component
              ((ComponentEntity *)local_350,
               (size_t)((__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> *)
                       &local_2d0->super_Logger)->_M_ptr);
    buildComponentIdMap(local_1c0,(ComponentPtr *)local_350,(IdMap *)local_258._16_8_,
                        (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_138);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_350._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_350._8_8_);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,
                    CONCAT71(local_220.field_2._M_allocated_capacity._1_7_,
                             local_220.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void Validator::ValidatorImpl::buildComponentIdMap(const ComponentPtr &component, IdMap &idMap, std::set<std::string> &reportedConnections)
{
    std::string info;

    // Component.
    if (!component->id().empty()) {
        std::string imported;
        std::string owning;
        if (component->isImport()) {
            imported = "imported ";
        }
        if (owningComponent(component) != nullptr) {
            owning = "' in component '" + owningComponent(component)->name() + "'";
        } else {
            owning = "' in model '" + owningModel(component)->name() + "'";
        }
        info = " - " + imported + "component '" + component->name() + owning;
        addIdMapItem(component->id(), info, idMap);
    }

    // Variables.
    for (size_t i = 0; i < component->variableCount(); ++i) {
        auto item = component->variable(i);
        if (!item->id().empty()) {
            info = " - variable '" + item->name() + "' in component '" + component->name() + "'";
            addIdMapItem(item->id(), info, idMap);
        }
        // Equivalent variables.
        for (size_t e = 0; e < item->equivalentVariableCount(); ++e) {
            auto equiv = item->equivalentVariable(e);
            auto equivParent = owningComponent(equiv);
            if (equivParent != nullptr) {
                // Skipping half of the equivalences to avoid duplicate reporting.
                std::string s1 = item->name() + component->name();
                std::string s2 = equiv->name() + equivParent->name();
                std::string mappingId = Variable::equivalenceMappingId(item, equiv);
                // Variable mapping.
                if ((s1 < s2) && !mappingId.empty()) {
                    std::string mappingDescription =
                        "between variable '" + item->name() + "' in component '" + component->name()
                        + "' and variable '" + equiv->name() + "' in component '" + equivParent->name() + "'";
                    // Check for a valid identifier.
                    if (!isValidXmlName(mappingId)) {
                        auto issue = Issue::IssueImpl::create();
                        issue->mPimpl->setReferenceRule(Issue::ReferenceRule::XML_ID_ATTRIBUTE);
                        issue->mPimpl->mItem->mPimpl->setMapVariables(item, equiv);
                        issue->mPimpl->setDescription("Variable equivalence " + mappingDescription + ", does not have a valid map_variables 'id' attribute, '" + mappingId + "'.");
                        addIssue(issue);
                    }

                    info = " - variable equivalence " + mappingDescription;
                    addIdMapItem(mappingId, info, idMap);
                }
                // Connections.
                auto connectionId = Variable::equivalenceConnectionId(item, equiv);
                std::string connection = component->name() < equivParent->name() ? component->name() + equivParent->name() : equivParent->name() + component->name();
                if ((s1 < s2) && !connectionId.empty() && (reportedConnections.count(connection) == 0)) {
                    std::string connectionDescription =
                        "between components '" + component->name() + "' and '" + equivParent->name()
                        + "' because of variable equivalence between variables '" + item->name()
                        + "' and '" + equiv->name() + "'";
                    // Check for a valid identifier.
                    if (!isValidXmlName(connectionId)) {
                        auto issue = Issue::IssueImpl::create();
                        issue->mPimpl->setReferenceRule(Issue::ReferenceRule::XML_ID_ATTRIBUTE);
                        issue->mPimpl->mItem->mPimpl->setConnection(item, equiv);
                        issue->mPimpl->setDescription("Connection " + connectionDescription + ", does not have a valid connection 'id' attribute, '" + connectionId + "'.");
                        addIssue(issue);
                    }

                    reportedConnections.insert(connection);
                    info = " - connection " + connectionDescription;
                    addIdMapItem(connectionId, info, idMap);
                }
            }
        }
    }

    // Resets.
    for (size_t i = 0; i < component->resetCount(); ++i) {
        auto item = component->reset(i);
        if (!item->id().empty()) {
            info = " - reset at index " + std::to_string(i) + " in component '" + component->name() + "'";
            addIdMapItem(item->id(), info, idMap);
        }
        if (!item->testValueId().empty()) {
            info = " - test_value in reset at index " + std::to_string(i) + " in component '" + component->name() + "'";
            addIdMapItem(item->testValueId(), info, idMap);
        }
        info = "test_value in reset " + std::to_string(i) + " in component '" + component->name() + "'";
        buildMathIdMap(info, idMap, item->testValue());
        if (!item->resetValueId().empty()) {
            info = " - reset_value in reset at index " + std::to_string(i) + " in component '" + component->name() + "'";
            addIdMapItem(item->resetValueId(), info, idMap);
        }
        info = "reset_value in reset " + std::to_string(i) + " in component '" + component->name() + "'";
        buildMathIdMap(info, idMap, item->resetValue());
    }

    // Maths.
    info = "math in component '" + component->name() + "'";
    buildMathIdMap(info, idMap, component->math());

    // Imports.
    if ((component->importSource() != nullptr) && !component->importSource()->id().empty()) {
        info = " - import source for component '" + component->name() + "'";
        addIdMapItem(component->importSource()->id(), info, idMap);
    }

    // Hierarchy.
    if (!component->encapsulationId().empty()) {
        // Check for a valid identifier.
        if (!isValidXmlName(component->encapsulationId())) {
            auto issue = Issue::IssueImpl::create();
            issue->mPimpl->setReferenceRule(Issue::ReferenceRule::XML_ID_ATTRIBUTE);
            issue->mPimpl->mItem->mPimpl->setComponent(component);
            issue->mPimpl->setDescription("Component '" + component->name() + "' does not have a valid encapsulation 'id' attribute, '" + component->encapsulationId() + "'.");
            addIssue(issue);
        }

        info = " - encapsulation component_ref to component '" + component->name() + "'";
        addIdMapItem(component->encapsulationId(), info, idMap);
    }

    // Child components.
    for (size_t c = 0; c < component->componentCount(); ++c) {
        buildComponentIdMap(component->component(c), idMap, reportedConnections);
    }
}